

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

void embree::avx2::CurveNiIntersectorK<4,8>::
     intersect_h<embree::avx2::RibbonCurve1IntersectorK<embree::HermiteCurveT,8,8>,embree::avx2::Intersect1KEpilogMU<8,8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  undefined1 (*pauVar1) [32];
  float *pfVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  Primitive PVar5;
  undefined4 uVar6;
  Geometry *pGVar7;
  RTCFilterFunctionN p_Var8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [12];
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [28];
  undefined1 auVar76 [32];
  int iVar77;
  uint uVar78;
  ulong uVar79;
  long lVar80;
  uint uVar81;
  ulong uVar82;
  long lVar83;
  undefined4 uVar84;
  undefined8 unaff_R13;
  long lVar85;
  undefined8 uVar86;
  float fVar107;
  vint4 bi_2;
  undefined1 auVar87 [16];
  float fVar105;
  float fVar109;
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  float fVar111;
  float fVar112;
  float fVar113;
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  float fVar106;
  float fVar108;
  float fVar110;
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar93 [16];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  vint4 bi_1;
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [64];
  float fVar136;
  float fVar137;
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [64];
  vint4 ai_2;
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  vint4 ai;
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [32];
  vint4 bi;
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  vint4 ai_1;
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  float fVar188;
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  float fVar191;
  undefined1 auVar189 [16];
  float fVar192;
  undefined1 auVar190 [32];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  float fVar200;
  float fVar201;
  float fVar202;
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar207 [64];
  undefined4 uVar208;
  undefined1 auVar209 [16];
  undefined8 uVar210;
  undefined8 uVar211;
  undefined8 uVar212;
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  undefined1 auVar215 [64];
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  float fVar224;
  float fVar225;
  float fVar226;
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  undefined1 auVar223 [64];
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  undefined8 local_8f0;
  undefined8 uStack_8e8;
  undefined8 local_8e0;
  undefined8 uStack_8d8;
  undefined8 local_850;
  undefined8 uStack_848;
  undefined8 local_840;
  undefined8 uStack_838;
  RTCFilterFunctionNArguments local_830;
  undefined1 local_800 [32];
  ulong local_7d0;
  undefined8 uStack_7c8;
  RayHitK<8> *local_7b8;
  undefined1 (*local_7b0) [32];
  ulong local_7a8;
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined8 local_760;
  undefined8 uStack_758;
  undefined8 uStack_750;
  undefined8 uStack_748;
  float local_740;
  float fStack_73c;
  float fStack_738;
  float fStack_734;
  float fStack_730;
  float fStack_72c;
  float fStack_728;
  float fStack_724;
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  LinearSpace3fa *local_668;
  undefined8 local_660;
  undefined8 uStack_658;
  undefined8 uStack_650;
  undefined8 uStack_648;
  undefined1 local_640 [32];
  undefined8 local_620;
  undefined8 uStack_618;
  undefined8 uStack_610;
  undefined8 uStack_608;
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined8 local_5a0;
  undefined8 uStack_598;
  undefined8 uStack_590;
  undefined8 uStack_588;
  undefined1 local_570 [16];
  undefined1 local_560 [16];
  undefined4 uStack_550;
  undefined4 uStack_54c;
  undefined4 uStack_548;
  undefined4 uStack_544;
  float local_540;
  float fStack_53c;
  float fStack_538;
  float fStack_534;
  uint uStack_530;
  uint uStack_52c;
  uint uStack_528;
  uint uStack_524;
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [8];
  float fStack_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  float fStack_4a4;
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [8];
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  undefined1 local_420 [32];
  undefined1 local_400 [16];
  undefined1 local_3f0 [16];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  int local_380;
  int local_37c;
  undefined8 local_370;
  undefined8 uStack_368;
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 local_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  float local_300 [4];
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  float fStack_2e4;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [8];
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  float fStack_264;
  undefined1 local_260 [32];
  undefined1 local_240 [8];
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  undefined4 uStack_224;
  undefined1 local_220 [32];
  undefined4 local_200;
  undefined4 uStack_1fc;
  undefined4 uStack_1f8;
  undefined4 uStack_1f4;
  undefined4 uStack_1f0;
  undefined4 uStack_1ec;
  undefined4 uStack_1e8;
  undefined4 uStack_1e4;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  float local_1a0;
  float fStack_19c;
  float fStack_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  undefined4 local_180;
  undefined4 uStack_17c;
  undefined4 uStack_178;
  undefined4 uStack_174;
  undefined4 uStack_170;
  undefined4 uStack_16c;
  undefined4 uStack_168;
  undefined4 uStack_164;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 uStack_130;
  undefined8 uStack_128;
  uint local_120;
  uint uStack_11c;
  uint uStack_118;
  uint uStack_114;
  uint uStack_110;
  uint uStack_10c;
  uint uStack_108;
  uint uStack_104;
  uint local_100;
  uint uStack_fc;
  uint uStack_f8;
  uint uStack_f4;
  uint uStack_f0;
  uint uStack_ec;
  uint uStack_e8;
  uint uStack_e4;
  float local_e0;
  float fStack_dc;
  float fStack_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  float fStack_c4;
  undefined4 local_c0;
  undefined4 uStack_bc;
  undefined4 uStack_b8;
  undefined4 uStack_b4;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  undefined4 uStack_a8;
  undefined4 uStack_a4;
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  PVar5 = prim[1];
  uVar79 = (ulong)(byte)PVar5;
  fVar137 = *(float *)(prim + uVar79 * 0x19 + 0x12);
  auVar9 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x10
                        );
  auVar9 = vinsertps_avx(auVar9,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar10 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar10 = vinsertps_avx(auVar10,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar9 = vsubps_avx(auVar9,*(undefined1 (*) [16])(prim + uVar79 * 0x19 + 6));
  auVar87._0_4_ = fVar137 * auVar9._0_4_;
  auVar87._4_4_ = fVar137 * auVar9._4_4_;
  auVar87._8_4_ = fVar137 * auVar9._8_4_;
  auVar87._12_4_ = fVar137 * auVar9._12_4_;
  auVar162._0_4_ = fVar137 * auVar10._0_4_;
  auVar162._4_4_ = fVar137 * auVar10._4_4_;
  auVar162._8_4_ = fVar137 * auVar10._8_4_;
  auVar162._12_4_ = fVar137 * auVar10._12_4_;
  auVar9 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar79 * 4 + 6)));
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar10 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar79 * 5 + 6)));
  auVar10 = vcvtdq2ps_avx(auVar10);
  auVar11 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar79 * 6 + 6)));
  auVar11 = vcvtdq2ps_avx(auVar11);
  auVar12 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar79 * 0xb + 6)));
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar189 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar79 * 0xc + 6)));
  auVar189 = vcvtdq2ps_avx(auVar189);
  auVar13 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar79 * 0xd + 6)));
  auVar13 = vcvtdq2ps_avx(auVar13);
  auVar90 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar79 * 0x12 + 6)));
  auVar90 = vcvtdq2ps_avx(auVar90);
  auVar89 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar79 * 0x13 + 6)));
  auVar89 = vcvtdq2ps_avx(auVar89);
  auVar138 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar79 * 0x14 + 6)));
  auVar138 = vcvtdq2ps_avx(auVar138);
  auVar218._4_4_ = auVar162._0_4_;
  auVar218._0_4_ = auVar162._0_4_;
  auVar218._8_4_ = auVar162._0_4_;
  auVar218._12_4_ = auVar162._0_4_;
  auVar115 = vshufps_avx(auVar162,auVar162,0x55);
  auVar88 = vshufps_avx(auVar162,auVar162,0xaa);
  fVar137 = auVar88._0_4_;
  auVar203._0_4_ = fVar137 * auVar11._0_4_;
  fVar105 = auVar88._4_4_;
  auVar203._4_4_ = fVar105 * auVar11._4_4_;
  fVar107 = auVar88._8_4_;
  auVar203._8_4_ = fVar107 * auVar11._8_4_;
  fVar109 = auVar88._12_4_;
  auVar203._12_4_ = fVar109 * auVar11._12_4_;
  auVar193._0_4_ = auVar13._0_4_ * fVar137;
  auVar193._4_4_ = auVar13._4_4_ * fVar105;
  auVar193._8_4_ = auVar13._8_4_ * fVar107;
  auVar193._12_4_ = auVar13._12_4_ * fVar109;
  auVar183._0_4_ = auVar138._0_4_ * fVar137;
  auVar183._4_4_ = auVar138._4_4_ * fVar105;
  auVar183._8_4_ = auVar138._8_4_ * fVar107;
  auVar183._12_4_ = auVar138._12_4_ * fVar109;
  auVar88 = vfmadd231ps_fma(auVar203,auVar115,auVar10);
  auVar116 = vfmadd231ps_fma(auVar193,auVar115,auVar189);
  auVar115 = vfmadd231ps_fma(auVar183,auVar89,auVar115);
  auVar151 = vfmadd231ps_fma(auVar88,auVar218,auVar9);
  auVar116 = vfmadd231ps_fma(auVar116,auVar218,auVar12);
  auVar158 = vfmadd231ps_fma(auVar115,auVar90,auVar218);
  auVar219._4_4_ = auVar87._0_4_;
  auVar219._0_4_ = auVar87._0_4_;
  auVar219._8_4_ = auVar87._0_4_;
  auVar219._12_4_ = auVar87._0_4_;
  auVar115 = vshufps_avx(auVar87,auVar87,0x55);
  auVar88 = vshufps_avx(auVar87,auVar87,0xaa);
  fVar137 = auVar88._0_4_;
  auVar163._0_4_ = fVar137 * auVar11._0_4_;
  fVar105 = auVar88._4_4_;
  auVar163._4_4_ = fVar105 * auVar11._4_4_;
  fVar107 = auVar88._8_4_;
  auVar163._8_4_ = fVar107 * auVar11._8_4_;
  fVar109 = auVar88._12_4_;
  auVar163._12_4_ = fVar109 * auVar11._12_4_;
  auVar114._0_4_ = auVar13._0_4_ * fVar137;
  auVar114._4_4_ = auVar13._4_4_ * fVar105;
  auVar114._8_4_ = auVar13._8_4_ * fVar107;
  auVar114._12_4_ = auVar13._12_4_ * fVar109;
  auVar88._0_4_ = auVar138._0_4_ * fVar137;
  auVar88._4_4_ = auVar138._4_4_ * fVar105;
  auVar88._8_4_ = auVar138._8_4_ * fVar107;
  auVar88._12_4_ = auVar138._12_4_ * fVar109;
  auVar10 = vfmadd231ps_fma(auVar163,auVar115,auVar10);
  auVar11 = vfmadd231ps_fma(auVar114,auVar115,auVar189);
  auVar189 = vfmadd231ps_fma(auVar88,auVar115,auVar89);
  auVar13 = vfmadd231ps_fma(auVar10,auVar219,auVar9);
  auVar89 = vfmadd231ps_fma(auVar11,auVar219,auVar12);
  local_3f0._8_4_ = 0x7fffffff;
  local_3f0._0_8_ = 0x7fffffff7fffffff;
  local_3f0._12_4_ = 0x7fffffff;
  auVar138 = vfmadd231ps_fma(auVar189,auVar219,auVar90);
  auVar9 = vandps_avx(auVar151,local_3f0);
  auVar157._8_4_ = 0x219392ef;
  auVar157._0_8_ = 0x219392ef219392ef;
  auVar157._12_4_ = 0x219392ef;
  auVar9 = vcmpps_avx(auVar9,auVar157,1);
  auVar10 = vblendvps_avx(auVar151,auVar157,auVar9);
  auVar9 = vandps_avx(auVar116,local_3f0);
  auVar9 = vcmpps_avx(auVar9,auVar157,1);
  auVar11 = vblendvps_avx(auVar116,auVar157,auVar9);
  auVar9 = vandps_avx(local_3f0,auVar158);
  auVar9 = vcmpps_avx(auVar9,auVar157,1);
  auVar9 = vblendvps_avx(auVar158,auVar157,auVar9);
  auVar12 = vrcpps_avx(auVar10);
  auVar184._8_4_ = 0x3f800000;
  auVar184._0_8_ = 0x3f8000003f800000;
  auVar184._12_4_ = 0x3f800000;
  auVar10 = vfnmadd213ps_fma(auVar10,auVar12,auVar184);
  auVar12 = vfmadd132ps_fma(auVar10,auVar12,auVar12);
  auVar10 = vrcpps_avx(auVar11);
  auVar11 = vfnmadd213ps_fma(auVar11,auVar10,auVar184);
  auVar189 = vfmadd132ps_fma(auVar11,auVar10,auVar10);
  auVar10 = vrcpps_avx(auVar9);
  auVar9 = vfnmadd213ps_fma(auVar9,auVar10,auVar184);
  auVar90 = vfmadd132ps_fma(auVar9,auVar10,auVar10);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar79 * 7 + 6);
  auVar9 = vpmovsxwd_avx(auVar9);
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar11 = vsubps_avx(auVar9,auVar13);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar79 * 9 + 6);
  auVar9 = vpmovsxwd_avx(auVar10);
  auVar158._0_4_ = auVar12._0_4_ * auVar11._0_4_;
  auVar158._4_4_ = auVar12._4_4_ * auVar11._4_4_;
  auVar158._8_4_ = auVar12._8_4_ * auVar11._8_4_;
  auVar158._12_4_ = auVar12._12_4_ * auVar11._12_4_;
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar9 = vsubps_avx(auVar9,auVar13);
  auVar164._0_4_ = auVar12._0_4_ * auVar9._0_4_;
  auVar164._4_4_ = auVar12._4_4_ * auVar9._4_4_;
  auVar164._8_4_ = auVar12._8_4_ * auVar9._8_4_;
  auVar164._12_4_ = auVar12._12_4_ * auVar9._12_4_;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar79 * 0xe + 6);
  auVar9 = vpmovsxwd_avx(auVar11);
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar10 = vsubps_avx(auVar9,auVar89);
  auVar116._1_3_ = 0;
  auVar116[0] = PVar5;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar5 * 0x10 + 6);
  auVar9 = vpmovsxwd_avx(auVar12);
  auVar177._0_4_ = auVar189._0_4_ * auVar10._0_4_;
  auVar177._4_4_ = auVar189._4_4_ * auVar10._4_4_;
  auVar177._8_4_ = auVar189._8_4_ * auVar10._8_4_;
  auVar177._12_4_ = auVar189._12_4_ * auVar10._12_4_;
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar9 = vsubps_avx(auVar9,auVar89);
  auVar115._0_4_ = auVar189._0_4_ * auVar9._0_4_;
  auVar115._4_4_ = auVar189._4_4_ * auVar9._4_4_;
  auVar115._8_4_ = auVar189._8_4_ * auVar9._8_4_;
  auVar115._12_4_ = auVar189._12_4_ * auVar9._12_4_;
  auVar189._8_8_ = 0;
  auVar189._0_8_ = *(ulong *)(prim + uVar79 * 0x15 + 6);
  auVar9 = vpmovsxwd_avx(auVar189);
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar9 = vsubps_avx(auVar9,auVar138);
  auVar151._0_4_ = auVar90._0_4_ * auVar9._0_4_;
  auVar151._4_4_ = auVar90._4_4_ * auVar9._4_4_;
  auVar151._8_4_ = auVar90._8_4_ * auVar9._8_4_;
  auVar151._12_4_ = auVar90._12_4_ * auVar9._12_4_;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar79 * 0x17 + 6);
  auVar9 = vpmovsxwd_avx(auVar13);
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar9 = vsubps_avx(auVar9,auVar138);
  auVar89._0_4_ = auVar90._0_4_ * auVar9._0_4_;
  auVar89._4_4_ = auVar90._4_4_ * auVar9._4_4_;
  auVar89._8_4_ = auVar90._8_4_ * auVar9._8_4_;
  auVar89._12_4_ = auVar90._12_4_ * auVar9._12_4_;
  auVar9 = vpminsd_avx(auVar158,auVar164);
  auVar10 = vpminsd_avx(auVar177,auVar115);
  auVar9 = vmaxps_avx(auVar9,auVar10);
  auVar10 = vpminsd_avx(auVar151,auVar89);
  uVar84 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar194._4_4_ = uVar84;
  auVar194._0_4_ = uVar84;
  auVar194._8_4_ = uVar84;
  auVar194._12_4_ = uVar84;
  auVar10 = vmaxps_avx(auVar10,auVar194);
  auVar9 = vmaxps_avx(auVar9,auVar10);
  local_400._0_4_ = auVar9._0_4_ * 0.99999964;
  local_400._4_4_ = auVar9._4_4_ * 0.99999964;
  local_400._8_4_ = auVar9._8_4_ * 0.99999964;
  local_400._12_4_ = auVar9._12_4_ * 0.99999964;
  auVar9 = vpmaxsd_avx(auVar158,auVar164);
  auVar10 = vpmaxsd_avx(auVar177,auVar115);
  auVar9 = vminps_avx(auVar9,auVar10);
  auVar10 = vpmaxsd_avx(auVar151,auVar89);
  uVar84 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar138._4_4_ = uVar84;
  auVar138._0_4_ = uVar84;
  auVar138._8_4_ = uVar84;
  auVar138._12_4_ = uVar84;
  auVar10 = vminps_avx(auVar10,auVar138);
  auVar9 = vminps_avx(auVar9,auVar10);
  auVar90._0_4_ = auVar9._0_4_ * 1.0000004;
  auVar90._4_4_ = auVar9._4_4_ * 1.0000004;
  auVar90._8_4_ = auVar9._8_4_ * 1.0000004;
  auVar90._12_4_ = auVar9._12_4_ * 1.0000004;
  auVar116[4] = PVar5;
  auVar116._5_3_ = 0;
  auVar116[8] = PVar5;
  auVar116._9_3_ = 0;
  auVar116[0xc] = PVar5;
  auVar116._13_3_ = 0;
  auVar10 = vpcmpgtd_avx(auVar116,_DAT_01f4ad30);
  auVar9 = vcmpps_avx(local_400,auVar90,2);
  auVar9 = vandps_avx(auVar9,auVar10);
  uVar84 = vmovmskps_avx(auVar9);
  uVar79 = CONCAT44((int)((ulong)unaff_R13 >> 0x20),uVar84);
  local_668 = pre->ray_space + k;
  local_660 = mm_lookupmask_ps._16_8_;
  uStack_658 = mm_lookupmask_ps._24_8_;
  uStack_650 = mm_lookupmask_ps._16_8_;
  uStack_648 = mm_lookupmask_ps._24_8_;
  local_7b0 = (undefined1 (*) [32])&local_120;
  iVar77 = 1 << ((uint)k & 0x1f);
  auVar101._4_4_ = iVar77;
  auVar101._0_4_ = iVar77;
  auVar101._8_4_ = iVar77;
  auVar101._12_4_ = iVar77;
  auVar101._16_4_ = iVar77;
  auVar101._20_4_ = iVar77;
  auVar101._24_4_ = iVar77;
  auVar101._28_4_ = iVar77;
  auVar117 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar101 = vpand_avx2(auVar101,auVar117);
  local_2a0 = vpcmpeqd_avx2(auVar101,auVar117);
  do {
    if (uVar79 == 0) {
      return;
    }
    lVar85 = 0;
    for (uVar82 = uVar79; (uVar82 & 1) == 0; uVar82 = uVar82 >> 1 | 0x8000000000000000) {
      lVar85 = lVar85 + 1;
    }
    local_700._4_4_ = *(undefined4 *)(prim + 2);
    local_720._4_4_ = *(undefined4 *)(prim + lVar85 * 4 + 6);
    local_7a8 = (ulong)(uint)local_720._4_4_;
    pGVar7 = (context->scene->geometries).items[CONCAT44(0,local_700._4_4_)].ptr;
    uVar82 = (ulong)*(uint *)(*(long *)&pGVar7->field_0x58 +
                             local_7a8 *
                             pGVar7[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                             _M_i);
    lVar83 = (long)pGVar7[1].intersectionFilterN * uVar82;
    lVar80 = (long)pGVar7[1].intersectionFilterN * (uVar82 + 1);
    lVar85 = *(long *)&pGVar7[1].time_range.upper;
    auVar9 = *(undefined1 (*) [16])(lVar85 + lVar83);
    auVar10 = *(undefined1 (*) [16])(lVar85 + lVar80);
    uVar84 = *(undefined4 *)(lVar85 + 0xc + lVar83);
    auVar185._4_4_ = uVar84;
    auVar185._0_4_ = uVar84;
    auVar185._8_4_ = uVar84;
    auVar185._12_4_ = uVar84;
    local_220._16_4_ = uVar84;
    local_220._0_16_ = auVar185;
    local_220._20_4_ = uVar84;
    local_220._24_4_ = uVar84;
    local_220._28_4_ = uVar84;
    iVar77 = (int)pGVar7[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    auVar11 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                            0x1c);
    auVar11 = vinsertps_avx(auVar11,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
    auVar91._8_4_ = 0xbeaaaaab;
    auVar91._0_8_ = 0xbeaaaaabbeaaaaab;
    auVar91._12_4_ = 0xbeaaaaab;
    auVar151 = vfnmadd132ps_fma(*(undefined1 (*) [16])
                                 (pGVar7[2].intersectionFilterN +
                                 uVar82 * (long)pGVar7[2].pointQueryFunc),auVar9,auVar91);
    auVar89 = vfmadd132ps_fma(*(undefined1 (*) [16])
                               (pGVar7[2].intersectionFilterN +
                               (long)pGVar7[2].pointQueryFunc * (uVar82 + 1)),auVar10,auVar91);
    auVar189 = vsubps_avx(auVar9,auVar11);
    uVar84 = auVar189._0_4_;
    auVar152._4_4_ = uVar84;
    auVar152._0_4_ = uVar84;
    auVar152._8_4_ = uVar84;
    auVar152._12_4_ = uVar84;
    auVar12 = vshufps_avx(auVar189,auVar189,0x55);
    auVar189 = vshufps_avx(auVar189,auVar189,0xaa);
    aVar3 = (local_668->vx).field_0;
    aVar4 = (local_668->vy).field_0;
    fVar137 = (local_668->vz).field_0.m128[0];
    fVar105 = *(float *)((long)&(local_668->vz).field_0 + 4);
    fVar107 = *(float *)((long)&(local_668->vz).field_0 + 8);
    fVar109 = *(float *)((long)&(local_668->vz).field_0 + 0xc);
    auVar165._0_4_ = fVar137 * auVar189._0_4_;
    auVar165._4_4_ = fVar105 * auVar189._4_4_;
    auVar165._8_4_ = fVar107 * auVar189._8_4_;
    auVar165._12_4_ = fVar109 * auVar189._12_4_;
    auVar12 = vfmadd231ps_fma(auVar165,(undefined1  [16])aVar4,auVar12);
    auVar138 = vfmadd231ps_fma(auVar12,(undefined1  [16])aVar3,auVar152);
    auVar13 = vinsertps_avx(auVar138,auVar185,0x30);
    auVar189 = vsubps_avx(auVar151,auVar11);
    uVar84 = auVar189._0_4_;
    auVar166._4_4_ = uVar84;
    auVar166._0_4_ = uVar84;
    auVar166._8_4_ = uVar84;
    auVar166._12_4_ = uVar84;
    auVar12 = vshufps_avx(auVar189,auVar189,0x55);
    auVar189 = vshufps_avx(auVar189,auVar189,0xaa);
    auVar204._0_4_ = fVar137 * auVar189._0_4_;
    auVar204._4_4_ = fVar105 * auVar189._4_4_;
    auVar204._8_4_ = fVar107 * auVar189._8_4_;
    auVar204._12_4_ = fVar109 * auVar189._12_4_;
    auVar12 = vfmadd231ps_fma(auVar204,(undefined1  [16])aVar4,auVar12);
    auVar115 = vfmadd231ps_fma(auVar12,(undefined1  [16])aVar3,auVar166);
    auVar12 = vblendps_avx(auVar115,auVar151,8);
    auVar90 = vsubps_avx(auVar89,auVar11);
    uVar84 = auVar90._0_4_;
    auVar186._4_4_ = uVar84;
    auVar186._0_4_ = uVar84;
    auVar186._8_4_ = uVar84;
    auVar186._12_4_ = uVar84;
    auVar189 = vshufps_avx(auVar90,auVar90,0x55);
    auVar90 = vshufps_avx(auVar90,auVar90,0xaa);
    auVar209._0_4_ = fVar137 * auVar90._0_4_;
    auVar209._4_4_ = fVar105 * auVar90._4_4_;
    auVar209._8_4_ = fVar107 * auVar90._8_4_;
    auVar209._12_4_ = fVar109 * auVar90._12_4_;
    auVar189 = vfmadd231ps_fma(auVar209,(undefined1  [16])aVar4,auVar189);
    auVar88 = vfmadd231ps_fma(auVar189,(undefined1  [16])aVar3,auVar186);
    auVar189 = vblendps_avx(auVar88,auVar89,8);
    auVar90 = vsubps_avx(auVar10,auVar11);
    auVar11 = vshufps_avx(auVar90,auVar90,0xaa);
    auVar187._0_4_ = fVar137 * auVar11._0_4_;
    auVar187._4_4_ = fVar105 * auVar11._4_4_;
    auVar187._8_4_ = fVar107 * auVar11._8_4_;
    auVar187._12_4_ = fVar109 * auVar11._12_4_;
    uVar84 = auVar90._0_4_;
    auVar178._4_4_ = uVar84;
    auVar178._0_4_ = uVar84;
    auVar178._8_4_ = uVar84;
    auVar178._12_4_ = uVar84;
    auVar11 = vshufps_avx(auVar90,auVar90,0x55);
    auVar11 = vfmadd231ps_fma(auVar187,(undefined1  [16])aVar4,auVar11);
    auVar116 = vfmadd231ps_fma(auVar11,(undefined1  [16])aVar3,auVar178);
    fVar137 = *(float *)(lVar85 + 0xc + lVar80);
    auVar92._4_4_ = fVar137;
    auVar92._0_4_ = fVar137;
    auVar92._8_4_ = fVar137;
    auVar92._12_4_ = fVar137;
    fStack_230 = fVar137;
    _local_240 = auVar92;
    fStack_22c = fVar137;
    fStack_228 = fVar137;
    uStack_224 = fVar137;
    auVar90 = vinsertps_avx(auVar116,auVar92,0x30);
    auVar11 = vandps_avx(auVar13,local_3f0);
    auVar12 = vandps_avx(auVar12,local_3f0);
    auVar13 = vmaxps_avx(auVar11,auVar12);
    auVar11 = vandps_avx(auVar189,local_3f0);
    auVar12 = vandps_avx(auVar90,local_3f0);
    auVar11 = vmaxps_avx(auVar11,auVar12);
    auVar11 = vmaxps_avx(auVar13,auVar11);
    auVar12 = vmovshdup_avx(auVar11);
    auVar12 = vmaxss_avx(auVar12,auVar11);
    auVar11 = vshufpd_avx(auVar11,auVar11,1);
    auVar11 = vmaxss_avx(auVar11,auVar12);
    lVar85 = (long)iVar77 * 0x44;
    auVar12 = vmovshdup_avx(auVar138);
    uVar86 = auVar12._0_8_;
    local_5c0._8_8_ = uVar86;
    local_5c0._0_8_ = uVar86;
    local_5c0._16_8_ = uVar86;
    local_5c0._24_8_ = uVar86;
    auVar12 = vmovshdup_avx(auVar115);
    uVar86 = auVar12._0_8_;
    local_520._8_8_ = uVar86;
    local_520._0_8_ = uVar86;
    local_520._16_8_ = uVar86;
    local_520._24_8_ = uVar86;
    auVar101 = *(undefined1 (*) [32])(bezier_basis0 + lVar85 + 0x908);
    auVar12 = vmovshdup_avx(auVar88);
    uVar86 = auVar12._0_8_;
    local_6e0._8_8_ = uVar86;
    local_6e0._0_8_ = uVar86;
    local_6e0._16_8_ = uVar86;
    local_6e0._24_8_ = uVar86;
    auVar12 = vmovshdup_avx(auVar116);
    local_620 = auVar12._0_8_;
    uVar208 = auVar88._0_4_;
    local_640._4_4_ = uVar208;
    local_640._0_4_ = uVar208;
    local_640._8_4_ = uVar208;
    local_640._12_4_ = uVar208;
    local_640._16_4_ = uVar208;
    local_640._20_4_ = uVar208;
    local_640._24_4_ = uVar208;
    local_640._28_4_ = uVar208;
    pauVar1 = (undefined1 (*) [32])(bezier_basis0 + lVar85 + 0xd8c);
    fVar105 = *(float *)*pauVar1;
    fStack_53c = *(float *)(bezier_basis0 + lVar85 + 0xd90);
    fStack_538 = *(float *)(bezier_basis0 + lVar85 + 0xd94);
    fStack_534 = *(float *)(bezier_basis0 + lVar85 + 0xd98);
    fVar107 = *(float *)(bezier_basis0 + lVar85 + 0xd9c);
    fVar109 = *(float *)(bezier_basis0 + lVar85 + 0xda0);
    fVar66 = *(float *)(bezier_basis0 + lVar85 + 0xda4);
    auVar75 = *(undefined1 (*) [28])*pauVar1;
    local_740 = auVar116._0_4_;
    auVar117._0_4_ = fVar105 * local_740;
    auVar117._4_4_ = fStack_53c * local_740;
    auVar117._8_4_ = fStack_538 * local_740;
    auVar117._12_4_ = fStack_534 * local_740;
    auVar117._16_4_ = fVar107 * local_740;
    auVar117._20_4_ = fVar109 * local_740;
    auVar117._24_4_ = fVar66 * local_740;
    auVar117._28_4_ = 0;
    auVar189 = vfmadd231ps_fma(auVar117,auVar101,local_640);
    fVar188 = auVar12._0_4_;
    auVar171._0_4_ = fVar188 * fVar105;
    fVar192 = auVar12._4_4_;
    auVar171._4_4_ = fVar192 * fStack_53c;
    auVar171._8_4_ = fVar188 * fStack_538;
    auVar171._12_4_ = fVar192 * fStack_534;
    auVar171._16_4_ = fVar188 * fVar107;
    auVar171._20_4_ = fVar192 * fVar109;
    auVar171._24_4_ = fVar188 * fVar66;
    auVar171._28_4_ = 0;
    auVar12 = vfmadd231ps_fma(auVar171,auVar101,local_6e0);
    auVar117 = *(undefined1 (*) [32])(bezier_basis0 + lVar85 + 0x484);
    uVar84 = auVar115._0_4_;
    auVar195._4_4_ = uVar84;
    auVar195._0_4_ = uVar84;
    auVar195._8_4_ = uVar84;
    auVar195._12_4_ = uVar84;
    auVar195._16_4_ = uVar84;
    auVar195._20_4_ = uVar84;
    auVar195._24_4_ = uVar84;
    auVar195._28_4_ = uVar84;
    auVar189 = vfmadd231ps_fma(ZEXT1632(auVar189),auVar117,auVar195);
    auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar117,local_520);
    auVar171 = *(undefined1 (*) [32])(bezier_basis0 + lVar85);
    auVar179._0_4_ = auVar138._0_4_;
    auVar179._4_4_ = auVar179._0_4_;
    auVar179._8_4_ = auVar179._0_4_;
    auVar179._12_4_ = auVar179._0_4_;
    auVar179._16_4_ = auVar179._0_4_;
    auVar179._20_4_ = auVar179._0_4_;
    auVar179._24_4_ = auVar179._0_4_;
    auVar179._28_4_ = auVar179._0_4_;
    auVar189 = vfmadd231ps_fma(ZEXT1632(auVar189),auVar171,auVar179);
    auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar171,local_5c0);
    auVar100 = *(undefined1 (*) [32])(bezier_basis1 + lVar85 + 0x908);
    fVar136 = *(float *)(bezier_basis1 + lVar85 + 0xd8c);
    fVar106 = *(float *)(bezier_basis1 + lVar85 + 0xd90);
    fVar108 = *(float *)(bezier_basis1 + lVar85 + 0xd94);
    fVar110 = *(float *)(bezier_basis1 + lVar85 + 0xd98);
    fVar111 = *(float *)(bezier_basis1 + lVar85 + 0xd9c);
    fVar112 = *(float *)(bezier_basis1 + lVar85 + 0xda0);
    fVar113 = *(float *)(bezier_basis1 + lVar85 + 0xda4);
    auVar124._4_4_ = fVar106 * local_740;
    auVar124._0_4_ = fVar136 * local_740;
    auVar124._8_4_ = fVar108 * local_740;
    auVar124._12_4_ = fVar110 * local_740;
    auVar124._16_4_ = fVar111 * local_740;
    auVar124._20_4_ = fVar112 * local_740;
    auVar124._24_4_ = fVar113 * local_740;
    auVar124._28_4_ = local_740;
    auVar13 = vfmadd231ps_fma(auVar124,auVar100,local_640);
    auVar199._4_4_ = fVar192 * fVar106;
    auVar199._0_4_ = fVar188 * fVar136;
    auVar199._8_4_ = fVar188 * fVar108;
    auVar199._12_4_ = fVar192 * fVar110;
    auVar199._16_4_ = fVar188 * fVar111;
    auVar199._20_4_ = fVar192 * fVar112;
    auVar199._24_4_ = fVar188 * fVar113;
    auVar199._28_4_ = uVar208;
    auVar90 = vfmadd231ps_fma(auVar199,auVar100,local_6e0);
    auVar124 = *(undefined1 (*) [32])(bezier_basis1 + lVar85 + 0x484);
    auVar215 = ZEXT3264(auVar124);
    auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar124,auVar195);
    auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar124,local_520);
    auVar199 = *(undefined1 (*) [32])(bezier_basis1 + lVar85);
    auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar199,auVar179);
    auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar199,local_5c0);
    auVar94 = ZEXT1632(auVar13);
    auVar118 = ZEXT1632(auVar189);
    local_460 = vsubps_avx(auVar94,auVar118);
    local_420 = ZEXT1632(auVar90);
    _local_440 = ZEXT1632(auVar12);
    local_480 = vsubps_avx(local_420,_local_440);
    auVar95._0_4_ = local_460._0_4_ * auVar12._0_4_;
    auVar95._4_4_ = local_460._4_4_ * auVar12._4_4_;
    auVar95._8_4_ = local_460._8_4_ * auVar12._8_4_;
    auVar95._12_4_ = local_460._12_4_ * auVar12._12_4_;
    auVar95._16_4_ = local_460._16_4_ * 0.0;
    auVar95._20_4_ = local_460._20_4_ * 0.0;
    auVar95._24_4_ = local_460._24_4_ * 0.0;
    auVar95._28_4_ = 0;
    fVar191 = local_480._0_4_;
    auVar119._0_4_ = fVar191 * auVar189._0_4_;
    fVar200 = local_480._4_4_;
    auVar119._4_4_ = fVar200 * auVar189._4_4_;
    fVar201 = local_480._8_4_;
    auVar119._8_4_ = fVar201 * auVar189._8_4_;
    fVar202 = local_480._12_4_;
    auVar119._12_4_ = fVar202 * auVar189._12_4_;
    fVar224 = local_480._16_4_;
    auVar119._16_4_ = fVar224 * 0.0;
    fVar225 = local_480._20_4_;
    auVar119._20_4_ = fVar225 * 0.0;
    fVar226 = local_480._24_4_;
    auVar119._24_4_ = fVar226 * 0.0;
    auVar119._28_4_ = 0;
    auVar95 = vsubps_avx(auVar95,auVar119);
    auVar12 = vpermilps_avx(auVar151,0xff);
    uVar86 = auVar12._0_8_;
    local_80._8_8_ = uVar86;
    local_80._0_8_ = uVar86;
    local_80._16_8_ = uVar86;
    local_80._24_8_ = uVar86;
    auVar189 = vpermilps_avx(auVar89,0xff);
    local_a0._0_8_ = auVar189._0_8_;
    local_a0._8_8_ = local_a0._0_8_;
    local_a0._16_8_ = local_a0._0_8_;
    local_a0._24_8_ = local_a0._0_8_;
    auVar173._4_4_ = fVar137 * fStack_53c;
    auVar173._0_4_ = fVar137 * fVar105;
    auVar173._8_4_ = fVar137 * fStack_538;
    auVar173._12_4_ = fVar137 * fStack_534;
    auVar173._16_4_ = fVar137 * fVar107;
    auVar173._20_4_ = fVar137 * fVar109;
    auVar173._24_4_ = fVar137 * fVar66;
    auVar173._28_4_ = auVar179._0_4_;
    auVar189 = vfmadd231ps_fma(auVar173,auVar101,local_a0);
    auVar189 = vfmadd231ps_fma(ZEXT1632(auVar189),auVar117,local_80);
    auVar189 = vfmadd231ps_fma(ZEXT1632(auVar189),auVar171,local_220);
    auVar14._4_4_ = fVar137 * fVar106;
    auVar14._0_4_ = fVar137 * fVar136;
    auVar14._8_4_ = fVar137 * fVar108;
    auVar14._12_4_ = fVar137 * fVar110;
    auVar14._16_4_ = fVar137 * fVar111;
    auVar14._20_4_ = fVar137 * fVar112;
    auVar14._24_4_ = fVar137 * fVar113;
    auVar14._28_4_ = fVar137;
    auVar13 = vfmadd231ps_fma(auVar14,auVar100,local_a0);
    auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar124,local_80);
    auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar199,local_220);
    auVar127._4_4_ = fVar200 * fVar200;
    auVar127._0_4_ = fVar191 * fVar191;
    auVar127._8_4_ = fVar201 * fVar201;
    auVar127._12_4_ = fVar202 * fVar202;
    auVar127._16_4_ = fVar224 * fVar224;
    auVar127._20_4_ = fVar225 * fVar225;
    auVar127._24_4_ = fVar226 * fVar226;
    auVar127._28_4_ = auVar12._4_4_;
    auVar12 = vfmadd231ps_fma(auVar127,local_460,local_460);
    auVar173 = vmaxps_avx(ZEXT1632(auVar189),ZEXT1632(auVar13));
    auVar206._4_4_ = auVar173._4_4_ * auVar173._4_4_ * auVar12._4_4_;
    auVar206._0_4_ = auVar173._0_4_ * auVar173._0_4_ * auVar12._0_4_;
    auVar206._8_4_ = auVar173._8_4_ * auVar173._8_4_ * auVar12._8_4_;
    auVar206._12_4_ = auVar173._12_4_ * auVar173._12_4_ * auVar12._12_4_;
    auVar206._16_4_ = auVar173._16_4_ * auVar173._16_4_ * 0.0;
    auVar206._20_4_ = auVar173._20_4_ * auVar173._20_4_ * 0.0;
    auVar206._24_4_ = auVar173._24_4_ * auVar173._24_4_ * 0.0;
    auVar206._28_4_ = auVar173._28_4_;
    auVar216._4_4_ = auVar95._4_4_ * auVar95._4_4_;
    auVar216._0_4_ = auVar95._0_4_ * auVar95._0_4_;
    auVar216._8_4_ = auVar95._8_4_ * auVar95._8_4_;
    auVar216._12_4_ = auVar95._12_4_ * auVar95._12_4_;
    auVar216._16_4_ = auVar95._16_4_ * auVar95._16_4_;
    auVar216._20_4_ = auVar95._20_4_ * auVar95._20_4_;
    auVar216._24_4_ = auVar95._24_4_ * auVar95._24_4_;
    auVar216._28_4_ = auVar95._28_4_;
    local_540 = (float)iVar77;
    auVar173 = vcmpps_avx(auVar216,auVar206,2);
    fVar137 = auVar11._0_4_ * 4.7683716e-07;
    auVar102._4_4_ = local_540;
    auVar102._0_4_ = local_540;
    auVar102._8_4_ = local_540;
    auVar102._12_4_ = local_540;
    auVar102._16_4_ = local_540;
    auVar102._20_4_ = local_540;
    auVar102._24_4_ = local_540;
    auVar102._28_4_ = local_540;
    auVar95 = vcmpps_avx(_DAT_01f7b060,auVar102,1);
    auVar11 = vpermilps_avx(auVar138,0xaa);
    uVar86 = auVar11._0_8_;
    auVar220._8_8_ = uVar86;
    auVar220._0_8_ = uVar86;
    auVar220._16_8_ = uVar86;
    auVar220._24_8_ = uVar86;
    auVar11 = vpermilps_avx(auVar115,0xaa);
    uVar86 = auVar11._0_8_;
    local_260._8_8_ = uVar86;
    local_260._0_8_ = uVar86;
    local_260._16_8_ = uVar86;
    local_260._24_8_ = uVar86;
    auVar11 = vpermilps_avx(auVar88,0xaa);
    local_5a0 = auVar11._0_8_;
    auVar11 = vpermilps_avx(auVar116,0xaa);
    uVar86 = auVar11._0_8_;
    auVar14 = auVar95 & auVar173;
    uVar81 = *(uint *)(ray + k * 4 + 0x60);
    local_7a0._0_16_ = ZEXT416(uVar81);
    uStack_7c8 = auVar116._8_8_;
    local_7d0 = CONCAT44(0,local_700._4_4_);
    local_560 = ZEXT416((uint)local_700._4_4_);
    local_570 = ZEXT416((uint)local_720._4_4_);
    local_840 = auVar9._0_8_;
    uStack_838 = auVar9._8_8_;
    local_8e0 = auVar151._0_8_;
    uStack_8d8 = auVar151._8_8_;
    local_8f0 = auVar89._0_8_;
    uStack_8e8 = auVar89._8_8_;
    local_850._0_4_ = auVar10._0_4_;
    fVar105 = (float)local_850;
    local_850._4_4_ = auVar10._4_4_;
    fVar107 = local_850._4_4_;
    uStack_848._0_4_ = auVar10._8_4_;
    fVar109 = (float)uStack_848;
    uStack_848._4_4_ = auVar10._12_4_;
    fVar66 = uStack_848._4_4_;
    local_850 = auVar10._0_8_;
    uStack_848 = auVar10._8_8_;
    uStack_758 = uVar86;
    uStack_750 = uVar86;
    uStack_748 = uVar86;
    fStack_73c = local_740;
    fStack_738 = local_740;
    fStack_734 = local_740;
    fStack_730 = local_740;
    fStack_72c = local_740;
    fStack_728 = local_740;
    fStack_724 = local_740;
    uStack_618 = local_620;
    uStack_610 = local_620;
    uStack_608 = local_620;
    uStack_598 = local_5a0;
    uStack_590 = local_5a0;
    uStack_588 = local_5a0;
    if ((((((((auVar14 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar14 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar14 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar14 >> 0x7f,0) != '\0') ||
          (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar14 >> 0xbf,0) != '\0') ||
        (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar14[0x1f] < '\0')
    {
      _local_4c0 = vandps_avx(auVar173,auVar95);
      fVar191 = auVar11._0_4_;
      fVar200 = auVar11._4_4_;
      auVar15._4_4_ = fVar200 * fVar106;
      auVar15._0_4_ = fVar191 * fVar136;
      auVar15._8_4_ = fVar191 * fVar108;
      auVar15._12_4_ = fVar200 * fVar110;
      auVar15._16_4_ = fVar191 * fVar111;
      auVar15._20_4_ = fVar200 * fVar112;
      auVar15._24_4_ = fVar191 * fVar113;
      auVar15._28_4_ = local_4c0._28_4_;
      auVar71._8_8_ = local_5a0;
      auVar71._0_8_ = local_5a0;
      auVar71._16_8_ = local_5a0;
      auVar71._24_8_ = local_5a0;
      auVar10 = vfmadd213ps_fma(auVar100,auVar71,auVar15);
      auVar10 = vfmadd213ps_fma(auVar124,local_260,ZEXT1632(auVar10));
      auVar10 = vfmadd213ps_fma(auVar199,auVar220,ZEXT1632(auVar10));
      local_4a0._0_4_ = auVar75._0_4_;
      local_4a0._4_4_ = auVar75._4_4_;
      fStack_498 = auVar75._8_4_;
      fStack_494 = auVar75._12_4_;
      fStack_490 = auVar75._16_4_;
      fStack_48c = auVar75._20_4_;
      fStack_488 = auVar75._24_4_;
      auVar96._0_4_ = fVar191 * (float)local_4a0._0_4_;
      auVar96._4_4_ = fVar200 * (float)local_4a0._4_4_;
      auVar96._8_4_ = fVar191 * fStack_498;
      auVar96._12_4_ = fVar200 * fStack_494;
      auVar96._16_4_ = fVar191 * fStack_490;
      auVar96._20_4_ = fVar200 * fStack_48c;
      auVar96._24_4_ = fVar191 * fStack_488;
      auVar96._28_4_ = 0;
      auVar11 = vfmadd213ps_fma(auVar101,auVar71,auVar96);
      auVar11 = vfmadd213ps_fma(auVar117,local_260,ZEXT1632(auVar11));
      auVar101 = *(undefined1 (*) [32])(bezier_basis0 + lVar85 + 0x1210);
      auVar117 = *(undefined1 (*) [32])(bezier_basis0 + lVar85 + 0x1694);
      auVar100 = *(undefined1 (*) [32])(bezier_basis0 + lVar85 + 0x1b18);
      fVar136 = *(float *)(bezier_basis0 + lVar85 + 0x1f9c);
      fVar106 = *(float *)(bezier_basis0 + lVar85 + 0x1fa0);
      fVar108 = *(float *)(bezier_basis0 + lVar85 + 0x1fa4);
      fVar110 = *(float *)(bezier_basis0 + lVar85 + 0x1fa8);
      fVar111 = *(float *)(bezier_basis0 + lVar85 + 0x1fac);
      fVar112 = *(float *)(bezier_basis0 + lVar85 + 0x1fb0);
      fVar113 = *(float *)(bezier_basis0 + lVar85 + 0x1fb4);
      auVar172._0_4_ = local_740 * fVar136;
      auVar172._4_4_ = local_740 * fVar106;
      auVar172._8_4_ = local_740 * fVar108;
      auVar172._12_4_ = local_740 * fVar110;
      auVar172._16_4_ = local_740 * fVar111;
      auVar172._20_4_ = local_740 * fVar112;
      auVar172._24_4_ = local_740 * fVar113;
      auVar172._28_4_ = 0;
      auVar16._4_4_ = fVar192 * fVar106;
      auVar16._0_4_ = fVar188 * fVar136;
      auVar16._8_4_ = fVar188 * fVar108;
      auVar16._12_4_ = fVar192 * fVar110;
      auVar16._16_4_ = fVar188 * fVar111;
      auVar16._20_4_ = fVar192 * fVar112;
      auVar16._24_4_ = fVar188 * fVar113;
      auVar16._28_4_ = *(undefined4 *)(bezier_basis1 + lVar85 + 0xda8);
      auVar205._0_4_ = fVar136 * fVar191;
      auVar205._4_4_ = fVar106 * fVar200;
      auVar205._8_4_ = fVar108 * fVar191;
      auVar205._12_4_ = fVar110 * fVar200;
      auVar205._16_4_ = fVar111 * fVar191;
      auVar205._20_4_ = fVar112 * fVar200;
      auVar205._24_4_ = fVar113 * fVar191;
      auVar205._28_4_ = 0;
      auVar12 = vfmadd231ps_fma(auVar172,auVar100,local_640);
      auVar90 = vfmadd231ps_fma(auVar16,auVar100,local_6e0);
      auVar138 = vfmadd231ps_fma(auVar205,auVar71,auVar100);
      auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar117,auVar195);
      auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar117,local_520);
      auVar138 = vfmadd231ps_fma(ZEXT1632(auVar138),local_260,auVar117);
      auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar101,auVar179);
      auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar101,local_5c0);
      auVar138 = vfmadd231ps_fma(ZEXT1632(auVar138),auVar101,auVar220);
      fVar136 = *(float *)(bezier_basis1 + lVar85 + 0x1f9c);
      fVar106 = *(float *)(bezier_basis1 + lVar85 + 0x1fa0);
      fVar108 = *(float *)(bezier_basis1 + lVar85 + 0x1fa4);
      fVar110 = *(float *)(bezier_basis1 + lVar85 + 0x1fa8);
      fVar111 = *(float *)(bezier_basis1 + lVar85 + 0x1fac);
      fVar112 = *(float *)(bezier_basis1 + lVar85 + 0x1fb0);
      fVar113 = *(float *)(bezier_basis1 + lVar85 + 0x1fb4);
      auVar100._4_4_ = local_740 * fVar106;
      auVar100._0_4_ = local_740 * fVar136;
      auVar100._8_4_ = local_740 * fVar108;
      auVar100._12_4_ = local_740 * fVar110;
      auVar100._16_4_ = local_740 * fVar111;
      auVar100._20_4_ = local_740 * fVar112;
      auVar100._24_4_ = local_740 * fVar113;
      auVar100._28_4_ = local_740;
      auVar17._4_4_ = fVar192 * fVar106;
      auVar17._0_4_ = fVar188 * fVar136;
      auVar17._8_4_ = fVar188 * fVar108;
      auVar17._12_4_ = fVar192 * fVar110;
      auVar17._16_4_ = fVar188 * fVar111;
      auVar17._20_4_ = fVar192 * fVar112;
      auVar17._24_4_ = fVar188 * fVar113;
      auVar17._28_4_ = fVar192;
      auVar18._4_4_ = fVar200 * fVar106;
      auVar18._0_4_ = fVar191 * fVar136;
      auVar18._8_4_ = fVar191 * fVar108;
      auVar18._12_4_ = fVar200 * fVar110;
      auVar18._16_4_ = fVar191 * fVar111;
      auVar18._20_4_ = fVar200 * fVar112;
      auVar18._24_4_ = fVar191 * fVar113;
      auVar18._28_4_ = fVar200;
      auVar101 = *(undefined1 (*) [32])(bezier_basis1 + lVar85 + 0x1b18);
      auVar115 = vfmadd231ps_fma(auVar100,auVar101,local_640);
      auVar88 = vfmadd231ps_fma(auVar17,auVar101,local_6e0);
      auVar116 = vfmadd231ps_fma(auVar18,auVar71,auVar101);
      auVar101 = *(undefined1 (*) [32])(bezier_basis1 + lVar85 + 0x1694);
      auVar115 = vfmadd231ps_fma(ZEXT1632(auVar115),auVar101,auVar195);
      auVar88 = vfmadd231ps_fma(ZEXT1632(auVar88),auVar101,local_520);
      auVar116 = vfmadd231ps_fma(ZEXT1632(auVar116),local_260,auVar101);
      auVar101 = *(undefined1 (*) [32])(bezier_basis1 + lVar85 + 0x1210);
      auVar115 = vfmadd231ps_fma(ZEXT1632(auVar115),auVar101,auVar179);
      auVar88 = vfmadd231ps_fma(ZEXT1632(auVar88),auVar101,local_5c0);
      auVar120._8_4_ = 0x7fffffff;
      auVar120._0_8_ = 0x7fffffff7fffffff;
      auVar120._12_4_ = 0x7fffffff;
      auVar120._16_4_ = 0x7fffffff;
      auVar120._20_4_ = 0x7fffffff;
      auVar120._24_4_ = 0x7fffffff;
      auVar120._28_4_ = 0x7fffffff;
      auVar116 = vfmadd231ps_fma(ZEXT1632(auVar116),auVar220,auVar101);
      auVar101 = vandps_avx(ZEXT1632(auVar12),auVar120);
      auVar117 = vandps_avx(ZEXT1632(auVar90),auVar120);
      auVar117 = vmaxps_avx(auVar101,auVar117);
      auVar101 = vandps_avx(ZEXT1632(auVar138),auVar120);
      auVar101 = vmaxps_avx(auVar117,auVar101);
      auVar147._4_4_ = fVar137;
      auVar147._0_4_ = fVar137;
      auVar147._8_4_ = fVar137;
      auVar147._12_4_ = fVar137;
      auVar147._16_4_ = fVar137;
      auVar147._20_4_ = fVar137;
      auVar147._24_4_ = fVar137;
      auVar147._28_4_ = fVar137;
      auVar101 = vcmpps_avx(auVar101,auVar147,1);
      auVar100 = vblendvps_avx(ZEXT1632(auVar12),local_460,auVar101);
      auVar124 = vblendvps_avx(ZEXT1632(auVar90),local_480,auVar101);
      auVar101 = vandps_avx(ZEXT1632(auVar115),auVar120);
      auVar117 = vandps_avx(ZEXT1632(auVar88),auVar120);
      auVar199 = vmaxps_avx(auVar101,auVar117);
      auVar101 = vandps_avx(ZEXT1632(auVar116),auVar120);
      auVar101 = vmaxps_avx(auVar199,auVar101);
      auVar173 = vcmpps_avx(auVar101,auVar147,1);
      auVar101 = vblendvps_avx(ZEXT1632(auVar115),local_460,auVar173);
      auVar199 = vblendvps_avx(ZEXT1632(auVar88),local_480,auVar173);
      auVar11 = vfmadd213ps_fma(auVar171,auVar220,ZEXT1632(auVar11));
      fVar188 = -auVar101._4_4_;
      auVar12 = vfmadd213ps_fma(auVar100,auVar100,ZEXT832(0) << 0x20);
      auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar124,auVar124);
      auVar171 = vrsqrtps_avx(ZEXT1632(auVar12));
      fVar136 = auVar171._0_4_;
      fVar106 = auVar171._4_4_;
      fVar108 = auVar171._8_4_;
      fVar110 = auVar171._12_4_;
      fVar111 = auVar171._16_4_;
      fVar112 = auVar171._20_4_;
      fVar113 = auVar171._24_4_;
      auVar19._4_4_ = fVar106 * fVar106 * fVar106 * auVar12._4_4_ * -0.5;
      auVar19._0_4_ = fVar136 * fVar136 * fVar136 * auVar12._0_4_ * -0.5;
      auVar19._8_4_ = fVar108 * fVar108 * fVar108 * auVar12._8_4_ * -0.5;
      auVar19._12_4_ = fVar110 * fVar110 * fVar110 * auVar12._12_4_ * -0.5;
      auVar19._16_4_ = fVar111 * fVar111 * fVar111 * -0.0;
      auVar19._20_4_ = fVar112 * fVar112 * fVar112 * -0.0;
      auVar19._24_4_ = fVar113 * fVar113 * fVar113 * -0.0;
      auVar19._28_4_ = auVar117._28_4_;
      auVar221._8_4_ = 0x3fc00000;
      auVar221._0_8_ = 0x3fc000003fc00000;
      auVar221._12_4_ = 0x3fc00000;
      auVar221._16_4_ = 0x3fc00000;
      auVar221._20_4_ = 0x3fc00000;
      auVar221._24_4_ = 0x3fc00000;
      auVar221._28_4_ = 0x3fc00000;
      auVar12 = vfmadd231ps_fma(auVar19,auVar221,auVar171);
      fVar136 = auVar12._0_4_;
      fVar106 = auVar12._4_4_;
      auVar20._4_4_ = fVar106 * auVar124._4_4_;
      auVar20._0_4_ = fVar136 * auVar124._0_4_;
      fVar108 = auVar12._8_4_;
      auVar20._8_4_ = fVar108 * auVar124._8_4_;
      fVar110 = auVar12._12_4_;
      auVar20._12_4_ = fVar110 * auVar124._12_4_;
      auVar20._16_4_ = auVar124._16_4_ * 0.0;
      auVar20._20_4_ = auVar124._20_4_ * 0.0;
      auVar20._24_4_ = auVar124._24_4_ * 0.0;
      auVar20._28_4_ = 0;
      auVar21._4_4_ = fVar106 * -auVar100._4_4_;
      auVar21._0_4_ = fVar136 * -auVar100._0_4_;
      auVar21._8_4_ = fVar108 * -auVar100._8_4_;
      auVar21._12_4_ = fVar110 * -auVar100._12_4_;
      auVar21._16_4_ = -auVar100._16_4_ * 0.0;
      auVar21._20_4_ = -auVar100._20_4_ * 0.0;
      auVar21._24_4_ = -auVar100._24_4_ * 0.0;
      auVar21._28_4_ = auVar171._28_4_;
      auVar12 = vfmadd213ps_fma(auVar101,auVar101,ZEXT832(0) << 0x20);
      auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar199,auVar199);
      auVar117 = vrsqrtps_avx(ZEXT1632(auVar12));
      auVar22._28_4_ = auVar173._28_4_;
      auVar22._0_28_ =
           ZEXT1628(CONCAT412(fVar110 * 0.0,
                              CONCAT48(fVar108 * 0.0,CONCAT44(fVar106 * 0.0,fVar136 * 0.0))));
      fVar136 = auVar117._0_4_;
      fVar106 = auVar117._4_4_;
      fVar108 = auVar117._8_4_;
      fVar110 = auVar117._12_4_;
      fVar111 = auVar117._16_4_;
      fVar112 = auVar117._20_4_;
      fVar113 = auVar117._24_4_;
      auVar23._4_4_ = fVar106 * fVar106 * fVar106 * auVar12._4_4_ * -0.5;
      auVar23._0_4_ = fVar136 * fVar136 * fVar136 * auVar12._0_4_ * -0.5;
      auVar23._8_4_ = fVar108 * fVar108 * fVar108 * auVar12._8_4_ * -0.5;
      auVar23._12_4_ = fVar110 * fVar110 * fVar110 * auVar12._12_4_ * -0.5;
      auVar23._16_4_ = fVar111 * fVar111 * fVar111 * -0.0;
      auVar23._20_4_ = fVar112 * fVar112 * fVar112 * -0.0;
      auVar23._24_4_ = fVar113 * fVar113 * fVar113 * -0.0;
      auVar23._28_4_ = 0;
      auVar12 = vfmadd231ps_fma(auVar23,auVar221,auVar117);
      fVar136 = auVar12._0_4_;
      fVar106 = auVar12._4_4_;
      auVar24._4_4_ = auVar199._4_4_ * fVar106;
      auVar24._0_4_ = auVar199._0_4_ * fVar136;
      fVar108 = auVar12._8_4_;
      auVar24._8_4_ = auVar199._8_4_ * fVar108;
      fVar110 = auVar12._12_4_;
      auVar24._12_4_ = auVar199._12_4_ * fVar110;
      auVar24._16_4_ = auVar199._16_4_ * 0.0;
      auVar24._20_4_ = auVar199._20_4_ * 0.0;
      auVar24._24_4_ = auVar199._24_4_ * 0.0;
      auVar24._28_4_ = auVar199._28_4_;
      auVar25._4_4_ = fVar106 * fVar188;
      auVar25._0_4_ = fVar136 * -auVar101._0_4_;
      auVar25._8_4_ = fVar108 * -auVar101._8_4_;
      auVar25._12_4_ = fVar110 * -auVar101._12_4_;
      auVar25._16_4_ = -auVar101._16_4_ * 0.0;
      auVar25._20_4_ = -auVar101._20_4_ * 0.0;
      auVar25._24_4_ = -auVar101._24_4_ * 0.0;
      auVar25._28_4_ = 0xbf000000;
      auVar26._28_4_ = auVar117._28_4_;
      auVar26._0_28_ =
           ZEXT1628(CONCAT412(fVar110 * 0.0,
                              CONCAT48(fVar108 * 0.0,CONCAT44(fVar106 * 0.0,fVar136 * 0.0))));
      auVar12 = vfmadd213ps_fma(auVar20,ZEXT1632(auVar189),auVar118);
      auVar117 = ZEXT1632(auVar189);
      auVar90 = vfmadd213ps_fma(auVar21,auVar117,_local_440);
      auVar138 = vfmadd213ps_fma(auVar22,auVar117,ZEXT1632(auVar11));
      auVar116 = vfnmadd213ps_fma(auVar20,auVar117,auVar118);
      auVar115 = vfmadd213ps_fma(auVar24,ZEXT1632(auVar13),auVar94);
      auVar158 = vfnmadd213ps_fma(auVar21,auVar117,_local_440);
      auVar117 = ZEXT1632(auVar13);
      auVar88 = vfmadd213ps_fma(auVar25,auVar117,local_420);
      auVar119 = ZEXT1632(auVar189);
      auVar157 = vfnmadd231ps_fma(ZEXT1632(auVar11),auVar119,auVar22);
      auVar11 = vfmadd213ps_fma(auVar26,auVar117,ZEXT1632(auVar10));
      auVar87 = vfnmadd213ps_fma(auVar24,auVar117,auVar94);
      auVar114 = vfnmadd213ps_fma(auVar25,auVar117,local_420);
      auVar162 = vfnmadd231ps_fma(ZEXT1632(auVar10),ZEXT1632(auVar13),auVar26);
      auVar117 = vsubps_avx(ZEXT1632(auVar88),ZEXT1632(auVar158));
      auVar171 = vsubps_avx(ZEXT1632(auVar11),ZEXT1632(auVar157));
      auVar118._4_4_ = auVar157._4_4_ * auVar117._4_4_;
      auVar118._0_4_ = auVar157._0_4_ * auVar117._0_4_;
      auVar118._8_4_ = auVar157._8_4_ * auVar117._8_4_;
      auVar118._12_4_ = auVar157._12_4_ * auVar117._12_4_;
      auVar118._16_4_ = auVar117._16_4_ * 0.0;
      auVar118._20_4_ = auVar117._20_4_ * 0.0;
      auVar118._24_4_ = auVar117._24_4_ * 0.0;
      auVar118._28_4_ = 0;
      auVar189 = vfmsub231ps_fma(auVar118,ZEXT1632(auVar158),auVar171);
      auVar27._4_4_ = auVar171._4_4_ * auVar116._4_4_;
      auVar27._0_4_ = auVar171._0_4_ * auVar116._0_4_;
      auVar27._8_4_ = auVar171._8_4_ * auVar116._8_4_;
      auVar27._12_4_ = auVar171._12_4_ * auVar116._12_4_;
      auVar27._16_4_ = auVar171._16_4_ * 0.0;
      auVar27._20_4_ = auVar171._20_4_ * 0.0;
      auVar27._24_4_ = auVar171._24_4_ * 0.0;
      auVar27._28_4_ = auVar171._28_4_;
      auVar171 = vsubps_avx(ZEXT1632(auVar115),ZEXT1632(auVar116));
      auVar10 = vfmsub231ps_fma(auVar27,ZEXT1632(auVar157),auVar171);
      auVar28._4_4_ = auVar158._4_4_ * auVar171._4_4_;
      auVar28._0_4_ = auVar158._0_4_ * auVar171._0_4_;
      auVar28._8_4_ = auVar158._8_4_ * auVar171._8_4_;
      auVar28._12_4_ = auVar158._12_4_ * auVar171._12_4_;
      auVar28._16_4_ = auVar171._16_4_ * 0.0;
      auVar28._20_4_ = auVar171._20_4_ * 0.0;
      auVar28._24_4_ = auVar171._24_4_ * 0.0;
      auVar28._28_4_ = auVar171._28_4_;
      auVar173 = ZEXT1632(auVar116);
      auVar116 = vfmsub231ps_fma(auVar28,auVar173,auVar117);
      auVar65._4_8_ = 0;
      auVar65._0_4_ = (uint)-auVar101._4_4_ ^ (uint)fVar188;
      auVar10 = vfmadd231ps_fma(ZEXT1632(auVar116),ZEXT1232(auVar65) << 0x20,ZEXT1632(auVar10));
      auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),ZEXT1232(auVar65) << 0x20,ZEXT1632(auVar189));
      auVar127 = vcmpps_avx(ZEXT1632(auVar10),ZEXT1232(auVar65) << 0x20,2);
      auVar101 = vblendvps_avx(ZEXT1632(auVar87),ZEXT1632(auVar12),auVar127);
      auVar117 = vblendvps_avx(ZEXT1632(auVar114),ZEXT1632(auVar90),auVar127);
      auVar171 = vblendvps_avx(ZEXT1632(auVar162),ZEXT1632(auVar138),auVar127);
      auVar215 = ZEXT3264(auVar171);
      auVar100 = vblendvps_avx(auVar173,ZEXT1632(auVar115),auVar127);
      auVar124 = vblendvps_avx(ZEXT1632(auVar158),ZEXT1632(auVar88),auVar127);
      auVar199 = vblendvps_avx(ZEXT1632(auVar157),ZEXT1632(auVar11),auVar127);
      auVar173 = vblendvps_avx(ZEXT1632(auVar115),auVar173,auVar127);
      auVar95 = vblendvps_avx(ZEXT1632(auVar88),ZEXT1632(auVar158),auVar127);
      auVar10 = vpackssdw_avx(local_4c0._0_16_,local_4c0._16_16_);
      auVar14 = vblendvps_avx(ZEXT1632(auVar11),ZEXT1632(auVar157),auVar127);
      auVar206 = vsubps_avx(auVar173,auVar101);
      auVar95 = vsubps_avx(auVar95,auVar117);
      auVar216 = vsubps_avx(auVar14,auVar171);
      auVar94 = vsubps_avx(auVar101,auVar100);
      auVar102 = vsubps_avx(auVar117,auVar124);
      auVar118 = vsubps_avx(auVar171,auVar199);
      auVar29._4_4_ = auVar216._4_4_ * auVar101._4_4_;
      auVar29._0_4_ = auVar216._0_4_ * auVar101._0_4_;
      auVar29._8_4_ = auVar216._8_4_ * auVar101._8_4_;
      auVar29._12_4_ = auVar216._12_4_ * auVar101._12_4_;
      auVar29._16_4_ = auVar216._16_4_ * auVar101._16_4_;
      auVar29._20_4_ = auVar216._20_4_ * auVar101._20_4_;
      auVar29._24_4_ = auVar216._24_4_ * auVar101._24_4_;
      auVar29._28_4_ = auVar14._28_4_;
      auVar11 = vfmsub231ps_fma(auVar29,auVar171,auVar206);
      auVar30._4_4_ = auVar206._4_4_ * auVar117._4_4_;
      auVar30._0_4_ = auVar206._0_4_ * auVar117._0_4_;
      auVar30._8_4_ = auVar206._8_4_ * auVar117._8_4_;
      auVar30._12_4_ = auVar206._12_4_ * auVar117._12_4_;
      auVar30._16_4_ = auVar206._16_4_ * auVar117._16_4_;
      auVar30._20_4_ = auVar206._20_4_ * auVar117._20_4_;
      auVar30._24_4_ = auVar206._24_4_ * auVar117._24_4_;
      auVar30._28_4_ = auVar173._28_4_;
      auVar12 = vfmsub231ps_fma(auVar30,auVar101,auVar95);
      auVar11 = vfmadd231ps_fma(ZEXT1632(auVar12),ZEXT832(0) << 0x20,ZEXT1632(auVar11));
      auVar97._0_4_ = auVar95._0_4_ * auVar171._0_4_;
      auVar97._4_4_ = auVar95._4_4_ * auVar171._4_4_;
      auVar97._8_4_ = auVar95._8_4_ * auVar171._8_4_;
      auVar97._12_4_ = auVar95._12_4_ * auVar171._12_4_;
      auVar97._16_4_ = auVar95._16_4_ * auVar171._16_4_;
      auVar97._20_4_ = auVar95._20_4_ * auVar171._20_4_;
      auVar97._24_4_ = auVar95._24_4_ * auVar171._24_4_;
      auVar97._28_4_ = 0;
      auVar12 = vfmsub231ps_fma(auVar97,auVar117,auVar216);
      auVar12 = vfmadd231ps_fma(ZEXT1632(auVar11),ZEXT832(0) << 0x20,ZEXT1632(auVar12));
      auVar98._0_4_ = auVar118._0_4_ * auVar100._0_4_;
      auVar98._4_4_ = auVar118._4_4_ * auVar100._4_4_;
      auVar98._8_4_ = auVar118._8_4_ * auVar100._8_4_;
      auVar98._12_4_ = auVar118._12_4_ * auVar100._12_4_;
      auVar98._16_4_ = auVar118._16_4_ * auVar100._16_4_;
      auVar98._20_4_ = auVar118._20_4_ * auVar100._20_4_;
      auVar98._24_4_ = auVar118._24_4_ * auVar100._24_4_;
      auVar98._28_4_ = 0;
      auVar11 = vfmsub231ps_fma(auVar98,auVar94,auVar199);
      auVar121._0_4_ = auVar102._0_4_ * auVar199._0_4_;
      auVar121._4_4_ = auVar102._4_4_ * auVar199._4_4_;
      auVar121._8_4_ = auVar102._8_4_ * auVar199._8_4_;
      auVar121._12_4_ = auVar102._12_4_ * auVar199._12_4_;
      auVar121._16_4_ = auVar102._16_4_ * auVar199._16_4_;
      auVar121._20_4_ = auVar102._20_4_ * auVar199._20_4_;
      auVar121._24_4_ = auVar102._24_4_ * auVar199._24_4_;
      auVar121._28_4_ = 0;
      auVar189 = vfmsub231ps_fma(auVar121,auVar124,auVar118);
      auVar31._4_4_ = auVar94._4_4_ * auVar124._4_4_;
      auVar31._0_4_ = auVar94._0_4_ * auVar124._0_4_;
      auVar31._8_4_ = auVar94._8_4_ * auVar124._8_4_;
      auVar31._12_4_ = auVar94._12_4_ * auVar124._12_4_;
      auVar31._16_4_ = auVar94._16_4_ * auVar124._16_4_;
      auVar31._20_4_ = auVar94._20_4_ * auVar124._20_4_;
      auVar31._24_4_ = auVar94._24_4_ * auVar124._24_4_;
      auVar31._28_4_ = auVar117._28_4_;
      auVar90 = vfmsub231ps_fma(auVar31,auVar102,auVar100);
      auVar11 = vfmadd231ps_fma(ZEXT1632(auVar90),ZEXT832(0) << 0x20,ZEXT1632(auVar11));
      auVar189 = vfmadd231ps_fma(ZEXT1632(auVar11),ZEXT832(0) << 0x20,ZEXT1632(auVar189));
      auVar100 = vmaxps_avx(ZEXT1632(auVar12),ZEXT1632(auVar189));
      auVar100 = vcmpps_avx(auVar100,ZEXT832(0) << 0x20,2);
      auVar11 = vpackssdw_avx(auVar100._0_16_,auVar100._16_16_);
      auVar10 = vpand_avx(auVar11,auVar10);
      auVar100 = vpmovsxwd_avx2(auVar10);
      if ((((((((auVar100 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar100 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar100 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar100 >> 0x7f,0) == '\0') &&
            (auVar100 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar100 >> 0xbf,0) == '\0') &&
          (auVar100 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar100[0x1f]) {
        auVar135 = ZEXT864(0) << 0x20;
LAB_011541d0:
        auVar150 = ZEXT3264(CONCAT824(uStack_648,
                                      CONCAT816(uStack_650,CONCAT88(uStack_658,local_660))));
        auVar101 = vpcmpeqd_avx2(auVar94,auVar94);
        auVar207 = ZEXT3264(auVar101);
      }
      else {
        auVar32._4_4_ = auVar95._4_4_ * auVar118._4_4_;
        auVar32._0_4_ = auVar95._0_4_ * auVar118._0_4_;
        auVar32._8_4_ = auVar95._8_4_ * auVar118._8_4_;
        auVar32._12_4_ = auVar95._12_4_ * auVar118._12_4_;
        auVar32._16_4_ = auVar95._16_4_ * auVar118._16_4_;
        auVar32._20_4_ = auVar95._20_4_ * auVar118._20_4_;
        auVar32._24_4_ = auVar95._24_4_ * auVar118._24_4_;
        auVar32._28_4_ = auVar100._28_4_;
        auVar115 = vfmsub231ps_fma(auVar32,auVar102,auVar216);
        auVar122._0_4_ = auVar94._0_4_ * auVar216._0_4_;
        auVar122._4_4_ = auVar94._4_4_ * auVar216._4_4_;
        auVar122._8_4_ = auVar94._8_4_ * auVar216._8_4_;
        auVar122._12_4_ = auVar94._12_4_ * auVar216._12_4_;
        auVar122._16_4_ = auVar94._16_4_ * auVar216._16_4_;
        auVar122._20_4_ = auVar94._20_4_ * auVar216._20_4_;
        auVar122._24_4_ = auVar94._24_4_ * auVar216._24_4_;
        auVar122._28_4_ = 0;
        auVar138 = vfmsub231ps_fma(auVar122,auVar206,auVar118);
        auVar33._4_4_ = auVar206._4_4_ * auVar102._4_4_;
        auVar33._0_4_ = auVar206._0_4_ * auVar102._0_4_;
        auVar33._8_4_ = auVar206._8_4_ * auVar102._8_4_;
        auVar33._12_4_ = auVar206._12_4_ * auVar102._12_4_;
        auVar33._16_4_ = auVar206._16_4_ * auVar102._16_4_;
        auVar33._20_4_ = auVar206._20_4_ * auVar102._20_4_;
        auVar33._24_4_ = auVar206._24_4_ * auVar102._24_4_;
        auVar33._28_4_ = auVar199._28_4_;
        auVar88 = vfmsub231ps_fma(auVar33,auVar94,auVar95);
        auVar11 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar138),ZEXT1632(auVar88));
        auVar90 = vfmadd231ps_fma(ZEXT1632(auVar11),ZEXT1632(auVar115),_DAT_01f7b000);
        auVar100 = vrcpps_avx(ZEXT1632(auVar90));
        auVar94._8_4_ = 0x3f800000;
        auVar94._0_8_ = 0x3f8000003f800000;
        auVar94._12_4_ = 0x3f800000;
        auVar94._16_4_ = 0x3f800000;
        auVar94._20_4_ = 0x3f800000;
        auVar94._24_4_ = 0x3f800000;
        auVar94._28_4_ = 0x3f800000;
        auVar11 = vfnmadd213ps_fma(auVar100,ZEXT1632(auVar90),auVar94);
        auVar11 = vfmadd132ps_fma(ZEXT1632(auVar11),auVar100,auVar100);
        auVar180._0_4_ = auVar171._0_4_ * auVar88._0_4_;
        auVar180._4_4_ = auVar171._4_4_ * auVar88._4_4_;
        auVar180._8_4_ = auVar171._8_4_ * auVar88._8_4_;
        auVar180._12_4_ = auVar171._12_4_ * auVar88._12_4_;
        auVar180._16_4_ = auVar171._16_4_ * 0.0;
        auVar180._20_4_ = auVar171._20_4_ * 0.0;
        auVar180._24_4_ = auVar171._24_4_ * 0.0;
        auVar180._28_4_ = 0;
        auVar138 = vfmadd231ps_fma(auVar180,ZEXT1632(auVar138),auVar117);
        auVar138 = vfmadd231ps_fma(ZEXT1632(auVar138),ZEXT1632(auVar115),auVar101);
        fVar136 = auVar11._0_4_;
        fVar106 = auVar11._4_4_;
        fVar108 = auVar11._8_4_;
        fVar110 = auVar11._12_4_;
        auVar171 = ZEXT1632(CONCAT412(fVar110 * auVar138._12_4_,
                                      CONCAT48(fVar108 * auVar138._8_4_,
                                               CONCAT44(fVar106 * auVar138._4_4_,
                                                        fVar136 * auVar138._0_4_))));
        auVar99._4_4_ = uVar81;
        auVar99._0_4_ = uVar81;
        auVar99._8_4_ = uVar81;
        auVar99._12_4_ = uVar81;
        auVar99._16_4_ = uVar81;
        auVar99._20_4_ = uVar81;
        auVar99._24_4_ = uVar81;
        auVar99._28_4_ = uVar81;
        uVar208 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar123._4_4_ = uVar208;
        auVar123._0_4_ = uVar208;
        auVar123._8_4_ = uVar208;
        auVar123._12_4_ = uVar208;
        auVar123._16_4_ = uVar208;
        auVar123._20_4_ = uVar208;
        auVar123._24_4_ = uVar208;
        auVar123._28_4_ = uVar208;
        auVar101 = vcmpps_avx(auVar99,auVar171,2);
        auVar117 = vcmpps_avx(auVar171,auVar123,2);
        auVar101 = vandps_avx(auVar117,auVar101);
        auVar11 = vpackssdw_avx(auVar101._0_16_,auVar101._16_16_);
        auVar10 = vpand_avx(auVar10,auVar11);
        auVar101 = vpmovsxwd_avx2(auVar10);
        auVar135 = ZEXT864(0) << 0x20;
        if ((((((((auVar101 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar101 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar101 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar101 >> 0x7f,0) == '\0') &&
              (auVar101 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar101 >> 0xbf,0) == '\0') &&
            (auVar101 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar101[0x1f]) goto LAB_011541d0;
        auVar101 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT1632(auVar90),4);
        auVar11 = vpackssdw_avx(auVar101._0_16_,auVar101._16_16_);
        auVar10 = vpand_avx(auVar10,auVar11);
        auVar117 = vpmovsxwd_avx2(auVar10);
        auVar150 = ZEXT3264(CONCAT824(uStack_648,
                                      CONCAT816(uStack_650,CONCAT88(uStack_658,local_660))));
        auVar101 = vpcmpeqd_avx2(auVar94,auVar94);
        auVar207 = ZEXT3264(auVar101);
        if ((((((((auVar117 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar117 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar117 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar117 >> 0x7f,0) != '\0') ||
              (auVar117 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar117 >> 0xbf,0) != '\0') ||
            (auVar117 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar117[0x1f] < '\0') {
          auVar100 = ZEXT1632(CONCAT412(fVar110 * auVar12._12_4_,
                                        CONCAT48(fVar108 * auVar12._8_4_,
                                                 CONCAT44(fVar106 * auVar12._4_4_,
                                                          fVar136 * auVar12._0_4_))));
          auVar124 = ZEXT1632(CONCAT412(fVar110 * auVar189._12_4_,
                                        CONCAT48(fVar108 * auVar189._8_4_,
                                                 CONCAT44(fVar106 * auVar189._4_4_,
                                                          fVar136 * auVar189._0_4_))));
          auVar161._8_4_ = 0x3f800000;
          auVar161._0_8_ = 0x3f8000003f800000;
          auVar161._12_4_ = 0x3f800000;
          auVar161._16_4_ = 0x3f800000;
          auVar161._20_4_ = 0x3f800000;
          auVar161._24_4_ = 0x3f800000;
          auVar161._28_4_ = 0x3f800000;
          auVar101 = vsubps_avx(auVar161,auVar100);
          _local_280 = vblendvps_avx(auVar101,auVar100,auVar127);
          auVar101 = vsubps_avx(auVar161,auVar124);
          local_4e0 = vblendvps_avx(auVar101,auVar124,auVar127);
          auVar150 = ZEXT3264(auVar117);
          local_5e0 = auVar171;
        }
      }
      auVar223 = ZEXT3264(auVar220);
      auVar101 = auVar150._0_32_;
      uVar210 = uVar86;
      uVar211 = uVar86;
      uVar212 = uVar86;
      if ((((((((auVar101 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar101 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar101 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar101 >> 0x7f,0) != '\0') ||
            (auVar150 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
           SUB321(auVar101 >> 0xbf,0) != '\0') ||
          (auVar150 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
          auVar150[0x1f] < '\0') {
        auVar117 = vsubps_avx(ZEXT1632(auVar13),auVar119);
        auVar10 = vfmadd213ps_fma(auVar117,_local_280,auVar119);
        fVar136 = *(float *)((long)pre->ray_space + k * 4 + -0x20);
        auVar34._4_4_ = (auVar10._4_4_ + auVar10._4_4_) * fVar136;
        auVar34._0_4_ = (auVar10._0_4_ + auVar10._0_4_) * fVar136;
        auVar34._8_4_ = (auVar10._8_4_ + auVar10._8_4_) * fVar136;
        auVar34._12_4_ = (auVar10._12_4_ + auVar10._12_4_) * fVar136;
        auVar34._16_4_ = fVar136 * 0.0;
        auVar34._20_4_ = fVar136 * 0.0;
        auVar34._24_4_ = fVar136 * 0.0;
        auVar34._28_4_ = 0;
        auVar117 = vcmpps_avx(local_5e0,auVar34,6);
        auVar171 = auVar101 & auVar117;
        if ((((((((auVar171 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar171 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar171 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar171 >> 0x7f,0) != '\0') ||
              (auVar171 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar171 >> 0xbf,0) != '\0') ||
            (auVar171 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar171[0x1f] < '\0') {
          auVar125._8_4_ = 0xbf800000;
          auVar125._0_8_ = 0xbf800000bf800000;
          auVar125._12_4_ = 0xbf800000;
          auVar125._16_4_ = 0xbf800000;
          auVar125._20_4_ = 0xbf800000;
          auVar125._24_4_ = 0xbf800000;
          auVar125._28_4_ = 0xbf800000;
          auVar148._8_4_ = 0x40000000;
          auVar148._0_8_ = 0x4000000040000000;
          auVar148._12_4_ = 0x40000000;
          auVar148._16_4_ = 0x40000000;
          auVar148._20_4_ = 0x40000000;
          auVar148._24_4_ = 0x40000000;
          auVar148._28_4_ = 0x40000000;
          auVar10 = vfmadd213ps_fma(local_4e0,auVar148,auVar125);
          local_3e0 = _local_280;
          local_3c0 = ZEXT1632(auVar10);
          local_3a0 = local_5e0;
          local_380 = 0;
          local_370 = local_840;
          uStack_368 = uStack_838;
          local_360 = local_8e0;
          uStack_358 = uStack_8d8;
          local_350 = local_8f0;
          uStack_348 = uStack_8e8;
          local_340 = local_850;
          uStack_338 = uStack_848;
          local_4e0 = local_3c0;
          if ((pGVar7->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
            local_6c0 = vandps_avx(auVar117,auVar101);
            fVar136 = 1.0 / local_540;
            local_300[0] = fVar136 * ((float)local_280._0_4_ + 0.0);
            local_300[1] = fVar136 * ((float)local_280._4_4_ + 1.0);
            local_300[2] = fVar136 * (fStack_278 + 2.0);
            local_300[3] = fVar136 * (fStack_274 + 3.0);
            fStack_2f0 = fVar136 * (fStack_270 + 4.0);
            fStack_2ec = fVar136 * (fStack_26c + 5.0);
            fStack_2e8 = fVar136 * (fStack_268 + 6.0);
            fStack_2e4 = fStack_264 + 7.0;
            local_4e0._0_8_ = auVar10._0_8_;
            local_4e0._8_8_ = auVar10._8_8_;
            local_2e0 = local_4e0._0_8_;
            uStack_2d8 = local_4e0._8_8_;
            uStack_2d0 = 0;
            uStack_2c8 = 0;
            local_2c0 = local_5e0;
            auVar126._8_4_ = 0x7f800000;
            auVar126._0_8_ = 0x7f8000007f800000;
            auVar126._12_4_ = 0x7f800000;
            auVar126._16_4_ = 0x7f800000;
            auVar126._20_4_ = 0x7f800000;
            auVar126._24_4_ = 0x7f800000;
            auVar126._28_4_ = 0x7f800000;
            auVar101 = vblendvps_avx(auVar126,local_5e0,local_6c0);
            auVar117 = vshufps_avx(auVar101,auVar101,0xb1);
            auVar117 = vminps_avx(auVar101,auVar117);
            auVar171 = vshufpd_avx(auVar117,auVar117,5);
            auVar117 = vminps_avx(auVar117,auVar171);
            auVar171 = vpermpd_avx2(auVar117,0x4e);
            auVar117 = vminps_avx(auVar117,auVar171);
            auVar117 = vcmpps_avx(auVar101,auVar117,0);
            auVar171 = local_6c0 & auVar117;
            auVar101 = local_6c0;
            if ((((((((auVar171 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar171 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar171 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar171 >> 0x7f,0) != '\0') ||
                  (auVar171 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar171 >> 0xbf,0) != '\0') ||
                (auVar171 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar171[0x1f] < '\0') {
              auVar101 = vandps_avx(auVar117,local_6c0);
            }
            uVar78 = vmovmskps_avx(auVar101);
            uVar81 = 0;
            for (; (uVar78 & 1) == 0; uVar78 = uVar78 >> 1 | 0x80000000) {
              uVar81 = uVar81 + 1;
            }
            uVar82 = (ulong)uVar81;
            if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
               (pGVar7->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
              fVar136 = local_300[uVar82];
              uVar208 = *(undefined4 *)((long)&local_2e0 + uVar82 * 4);
              fVar108 = 1.0 - fVar136;
              fVar106 = fVar108 * fVar108 * -3.0;
              auVar10 = vfmadd231ss_fma(ZEXT416((uint)(fVar108 * fVar108)),
                                        ZEXT416((uint)(fVar136 * fVar108)),ZEXT416(0xc0000000));
              auVar11 = vfmsub132ss_fma(ZEXT416((uint)(fVar136 * fVar108)),
                                        ZEXT416((uint)(fVar136 * fVar136)),ZEXT416(0x40000000));
              fVar108 = auVar10._0_4_ * 3.0;
              fVar110 = auVar11._0_4_ * 3.0;
              fVar111 = fVar136 * fVar136 * 3.0;
              auVar167._0_4_ = fVar111 * fVar105;
              auVar167._4_4_ = fVar111 * fVar107;
              auVar167._8_4_ = fVar111 * fVar109;
              auVar167._12_4_ = fVar111 * fVar66;
              auVar139._4_4_ = fVar110;
              auVar139._0_4_ = fVar110;
              auVar139._8_4_ = fVar110;
              auVar139._12_4_ = fVar110;
              auVar10 = vfmadd132ps_fma(auVar139,auVar167,auVar89);
              auVar153._4_4_ = fVar108;
              auVar153._0_4_ = fVar108;
              auVar153._8_4_ = fVar108;
              auVar153._12_4_ = fVar108;
              auVar10 = vfmadd132ps_fma(auVar153,auVar10,auVar151);
              auVar140._4_4_ = fVar106;
              auVar140._0_4_ = fVar106;
              auVar140._8_4_ = fVar106;
              auVar140._12_4_ = fVar106;
              auVar10 = vfmadd132ps_fma(auVar140,auVar10,auVar9);
              *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_2c0 + uVar82 * 4);
              *(int *)(ray + k * 4 + 0x180) = auVar10._0_4_;
              uVar6 = vextractps_avx(auVar10,1);
              *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar6;
              uVar6 = vextractps_avx(auVar10,2);
              *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar6;
              *(float *)(ray + k * 4 + 0x1e0) = fVar136;
              *(undefined4 *)(ray + k * 4 + 0x200) = uVar208;
              *(undefined4 *)(ray + k * 4 + 0x220) = local_720._4_4_;
              *(undefined4 *)(ray + k * 4 + 0x240) = local_700._4_4_;
              *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
              *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
            }
            else {
              local_700._0_4_ = local_700._4_4_;
              local_700._8_4_ = local_700._4_4_;
              local_700._12_4_ = local_700._4_4_;
              local_700._16_4_ = local_700._4_4_;
              local_700._20_4_ = local_700._4_4_;
              local_700._24_4_ = local_700._4_4_;
              local_700._28_4_ = local_700._4_4_;
              local_720._0_4_ = local_720._4_4_;
              local_720._8_4_ = local_720._4_4_;
              local_720._12_4_ = local_720._4_4_;
              local_720._16_4_ = local_720._4_4_;
              local_720._20_4_ = local_720._4_4_;
              local_720._24_4_ = local_720._4_4_;
              local_720._28_4_ = local_720._4_4_;
              uVar208 = *(undefined4 *)(ray + k * 4 + 0x100);
              local_800 = auVar220;
              local_760 = uVar86;
              _local_4a0 = *pauVar1;
              local_37c = iVar77;
              while( true ) {
                local_1a0 = local_300[uVar82];
                local_180 = *(undefined4 *)((long)&local_2e0 + uVar82 * 4);
                *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_2c0 + uVar82 * 4);
                fVar108 = 1.0 - local_1a0;
                auVar11 = vfmadd231ss_fma(ZEXT416((uint)(fVar108 * fVar108)),
                                          ZEXT416((uint)(local_1a0 * fVar108)),ZEXT416(0xc0000000));
                auVar10 = vfmsub132ss_fma(ZEXT416((uint)(local_1a0 * fVar108)),
                                          ZEXT416((uint)(local_1a0 * local_1a0)),ZEXT416(0x40000000)
                                         );
                fVar136 = auVar10._0_4_ * 3.0;
                fVar106 = local_1a0 * local_1a0 * 3.0;
                auVar170._0_4_ = fVar106 * fVar105;
                auVar170._4_4_ = fVar106 * fVar107;
                auVar170._8_4_ = fVar106 * fVar109;
                auVar170._12_4_ = fVar106 * fVar66;
                auVar145._4_4_ = fVar136;
                auVar145._0_4_ = fVar136;
                auVar145._8_4_ = fVar136;
                auVar145._12_4_ = fVar136;
                auVar10 = vfmadd132ps_fma(auVar145,auVar170,auVar89);
                fVar136 = auVar11._0_4_ * 3.0;
                auVar160._4_4_ = fVar136;
                auVar160._0_4_ = fVar136;
                auVar160._8_4_ = fVar136;
                auVar160._12_4_ = fVar136;
                auVar10 = vfmadd132ps_fma(auVar160,auVar10,auVar151);
                fVar136 = fVar108 * fVar108 * -3.0;
                local_830.context = context->user;
                auVar146._4_4_ = fVar136;
                auVar146._0_4_ = fVar136;
                auVar146._8_4_ = fVar136;
                auVar146._12_4_ = fVar136;
                auVar11 = vfmadd132ps_fma(auVar146,auVar10,auVar9);
                local_200 = auVar11._0_4_;
                uStack_1fc = local_200;
                uStack_1f8 = local_200;
                uStack_1f4 = local_200;
                uStack_1f0 = local_200;
                uStack_1ec = local_200;
                uStack_1e8 = local_200;
                uStack_1e4 = local_200;
                auVar10 = vmovshdup_avx(auVar11);
                local_1e0 = auVar10._0_8_;
                uStack_1d8 = local_1e0;
                uStack_1d0 = local_1e0;
                uStack_1c8 = local_1e0;
                auVar10 = vshufps_avx(auVar11,auVar11,0xaa);
                local_1c0 = auVar10._0_8_;
                uStack_1b8 = local_1c0;
                uStack_1b0 = local_1c0;
                uStack_1a8 = local_1c0;
                fStack_19c = local_1a0;
                fStack_198 = local_1a0;
                fStack_194 = local_1a0;
                fStack_190 = local_1a0;
                fStack_18c = local_1a0;
                fStack_188 = local_1a0;
                fStack_184 = local_1a0;
                uStack_17c = local_180;
                uStack_178 = local_180;
                uStack_174 = local_180;
                uStack_170 = local_180;
                uStack_16c = local_180;
                uStack_168 = local_180;
                uStack_164 = local_180;
                local_160 = local_720._0_8_;
                uStack_158 = local_720._8_8_;
                uStack_150 = local_720._16_8_;
                uStack_148 = local_720._24_8_;
                local_140 = local_700._0_8_;
                uStack_138 = local_700._8_8_;
                uStack_130 = local_700._16_8_;
                uStack_128 = local_700._24_8_;
                local_7b0[1] = auVar207._0_32_;
                *local_7b0 = auVar207._0_32_;
                local_120 = (local_830.context)->instID[0];
                uStack_11c = local_120;
                uStack_118 = local_120;
                uStack_114 = local_120;
                uStack_110 = local_120;
                uStack_10c = local_120;
                uStack_108 = local_120;
                uStack_104 = local_120;
                local_100 = (local_830.context)->instPrimID[0];
                uStack_fc = local_100;
                uStack_f8 = local_100;
                uStack_f4 = local_100;
                uStack_f0 = local_100;
                uStack_ec = local_100;
                uStack_e8 = local_100;
                uStack_e4 = local_100;
                local_6a0 = local_2a0;
                local_830.valid = (int *)local_6a0;
                local_830.geometryUserPtr = pGVar7->userPtr;
                local_830.hit = (RTCHitN *)&local_200;
                local_830.N = 8;
                local_830.ray = (RTCRayN *)ray;
                if (pGVar7->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                  auVar101 = ZEXT1632(auVar207._0_16_);
                  auVar215 = ZEXT1664(auVar215._0_16_);
                  (*pGVar7->intersectionFilterN)(&local_830);
                  auVar223 = ZEXT3264(local_800);
                  auVar101 = vpcmpeqd_avx2(auVar101,auVar101);
                  auVar207 = ZEXT3264(auVar101);
                  auVar135 = ZEXT1664(ZEXT816(0) << 0x40);
                  uVar86 = local_760;
                  uVar210 = uStack_758;
                  uVar211 = uStack_750;
                  uVar212 = uStack_748;
                }
                auVar117 = vpcmpeqd_avx2(auVar135._0_32_,local_6a0);
                auVar101 = auVar207._0_32_ & ~auVar117;
                if ((((((((auVar101 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar101 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar101 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar101 >> 0x7f,0) == '\0') &&
                      (auVar101 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar101 >> 0xbf,0) == '\0') &&
                    (auVar101 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar101[0x1f]) {
                  auVar117 = auVar207._0_32_ ^ auVar117;
                }
                else {
                  p_Var8 = context->args->filter;
                  if ((p_Var8 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar7->field_8).field_0x2 & 0x40) != 0))
                     )) {
                    auVar101 = ZEXT1632(auVar207._0_16_);
                    auVar215 = ZEXT1664(auVar215._0_16_);
                    (*p_Var8)(&local_830);
                    auVar223 = ZEXT3264(local_800);
                    auVar101 = vpcmpeqd_avx2(auVar101,auVar101);
                    auVar207 = ZEXT3264(auVar101);
                    auVar135 = ZEXT1664(ZEXT816(0) << 0x40);
                    uVar86 = local_760;
                    uVar210 = uStack_758;
                    uVar211 = uStack_750;
                    uVar212 = uStack_748;
                  }
                  auVar171 = vpcmpeqd_avx2(auVar135._0_32_,local_6a0);
                  auVar117 = auVar207._0_32_ ^ auVar171;
                  auVar101 = auVar207._0_32_ & ~auVar171;
                  if ((((((((auVar101 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar101 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar101 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar101 >> 0x7f,0) != '\0') ||
                        (auVar101 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar101 >> 0xbf,0) != '\0') ||
                      (auVar101 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar101[0x1f] < '\0') {
                    auVar133._0_4_ = auVar207._0_4_ ^ auVar171._0_4_;
                    auVar133._4_4_ = auVar207._4_4_ ^ auVar171._4_4_;
                    auVar133._8_4_ = auVar207._8_4_ ^ auVar171._8_4_;
                    auVar133._12_4_ = auVar207._12_4_ ^ auVar171._12_4_;
                    auVar133._16_4_ = auVar207._16_4_ ^ auVar171._16_4_;
                    auVar133._20_4_ = auVar207._20_4_ ^ auVar171._20_4_;
                    auVar133._24_4_ = auVar207._24_4_ ^ auVar171._24_4_;
                    auVar133._28_4_ = auVar207._28_4_ ^ auVar171._28_4_;
                    auVar101 = vmaskmovps_avx(auVar133,*(undefined1 (*) [32])local_830.hit);
                    *(undefined1 (*) [32])(local_830.ray + 0x180) = auVar101;
                    auVar101 = vmaskmovps_avx(auVar133,*(undefined1 (*) [32])(local_830.hit + 0x20))
                    ;
                    *(undefined1 (*) [32])(local_830.ray + 0x1a0) = auVar101;
                    auVar101 = vmaskmovps_avx(auVar133,*(undefined1 (*) [32])(local_830.hit + 0x40))
                    ;
                    *(undefined1 (*) [32])(local_830.ray + 0x1c0) = auVar101;
                    auVar101 = vmaskmovps_avx(auVar133,*(undefined1 (*) [32])(local_830.hit + 0x60))
                    ;
                    *(undefined1 (*) [32])(local_830.ray + 0x1e0) = auVar101;
                    auVar101 = vmaskmovps_avx(auVar133,*(undefined1 (*) [32])(local_830.hit + 0x80))
                    ;
                    *(undefined1 (*) [32])(local_830.ray + 0x200) = auVar101;
                    auVar101 = vpmaskmovd_avx2(auVar133,*(undefined1 (*) [32])(local_830.hit + 0xa0)
                                              );
                    *(undefined1 (*) [32])(local_830.ray + 0x220) = auVar101;
                    auVar101 = vpmaskmovd_avx2(auVar133,*(undefined1 (*) [32])(local_830.hit + 0xc0)
                                              );
                    *(undefined1 (*) [32])(local_830.ray + 0x240) = auVar101;
                    auVar101 = vpmaskmovd_avx2(auVar133,*(undefined1 (*) [32])(local_830.hit + 0xe0)
                                              );
                    *(undefined1 (*) [32])(local_830.ray + 0x260) = auVar101;
                    auVar101 = vpmaskmovd_avx2(auVar133,*(undefined1 (*) [32])
                                                         (local_830.hit + 0x100));
                    *(undefined1 (*) [32])(local_830.ray + 0x280) = auVar101;
                  }
                }
                auVar101 = local_5e0;
                auVar220 = auVar223._0_32_;
                if ((((((((auVar117 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar117 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar117 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar117 >> 0x7f,0) == '\0') &&
                      (auVar117 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar117 >> 0xbf,0) == '\0') &&
                    (auVar117 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar117[0x1f]) {
                  *(undefined4 *)(ray + k * 4 + 0x100) = uVar208;
                }
                else {
                  uVar208 = *(undefined4 *)(ray + k * 4 + 0x100);
                }
                *(undefined4 *)(local_6c0 + uVar82 * 4) = 0;
                auVar104._4_4_ = uVar208;
                auVar104._0_4_ = uVar208;
                auVar104._8_4_ = uVar208;
                auVar104._12_4_ = uVar208;
                auVar104._16_4_ = uVar208;
                auVar104._20_4_ = uVar208;
                auVar104._24_4_ = uVar208;
                auVar104._28_4_ = uVar208;
                auVar171 = vcmpps_avx(auVar101,auVar104,2);
                auVar117 = vandps_avx(auVar171,local_6c0);
                local_6c0 = local_6c0 & auVar171;
                if ((((((((local_6c0 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (local_6c0 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (local_6c0 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(local_6c0 >> 0x7f,0) == '\0') &&
                      (local_6c0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(local_6c0 >> 0xbf,0) == '\0') &&
                    (local_6c0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < local_6c0[0x1f]) break;
                auVar134._8_4_ = 0x7f800000;
                auVar134._0_8_ = 0x7f8000007f800000;
                auVar134._12_4_ = 0x7f800000;
                auVar134._16_4_ = 0x7f800000;
                auVar134._20_4_ = 0x7f800000;
                auVar134._24_4_ = 0x7f800000;
                auVar134._28_4_ = 0x7f800000;
                auVar101 = vblendvps_avx(auVar134,auVar101,auVar117);
                auVar171 = vshufps_avx(auVar101,auVar101,0xb1);
                auVar171 = vminps_avx(auVar101,auVar171);
                auVar100 = vshufpd_avx(auVar171,auVar171,5);
                auVar171 = vminps_avx(auVar171,auVar100);
                auVar100 = vpermpd_avx2(auVar171,0x4e);
                auVar171 = vminps_avx(auVar171,auVar100);
                auVar171 = vcmpps_avx(auVar101,auVar171,0);
                auVar100 = auVar117 & auVar171;
                auVar101 = auVar117;
                if ((((((((auVar100 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar100 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar100 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar100 >> 0x7f,0) != '\0') ||
                      (auVar100 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar100 >> 0xbf,0) != '\0') ||
                    (auVar100 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar100[0x1f] < '\0') {
                  auVar101 = vandps_avx(auVar171,auVar117);
                }
                uVar78 = vmovmskps_avx(auVar101);
                uVar81 = 0;
                for (; (uVar78 & 1) == 0; uVar78 = uVar78 >> 1 | 0x80000000) {
                  uVar81 = uVar81 + 1;
                }
                uVar82 = (ulong)uVar81;
                local_6c0 = auVar117;
              }
            }
          }
        }
      }
      uStack_758 = uVar210;
      uStack_750 = uVar211;
      uStack_748 = uVar212;
      local_700._4_4_ = local_560._0_4_;
    }
    local_560._0_4_ = local_700._4_4_;
    auVar135 = ZEXT3264(local_780);
    auVar207 = ZEXT3264(local_640);
    auVar150 = ZEXT3264(CONCAT428(fStack_724,
                                  CONCAT424(fStack_728,
                                            CONCAT420(fStack_72c,
                                                      CONCAT416(fStack_730,
                                                                CONCAT412(fStack_734,
                                                                          CONCAT48(fStack_738,
                                                                                   CONCAT44(
                                                  fStack_73c,local_740))))))));
    if (8 < iVar77) {
      local_480._4_4_ = iVar77;
      local_480._0_4_ = iVar77;
      local_480._8_4_ = iVar77;
      local_480._12_4_ = iVar77;
      local_480._16_4_ = iVar77;
      local_480._20_4_ = iVar77;
      local_480._24_4_ = iVar77;
      local_480._28_4_ = iVar77;
      local_4c0._4_4_ = fVar137;
      local_4c0._0_4_ = fVar137;
      fStack_4b8 = fVar137;
      fStack_4b4 = fVar137;
      fStack_4b0 = fVar137;
      fStack_4ac = fVar137;
      fStack_4a8 = fVar137;
      fStack_4a4 = fVar137;
      local_c0 = local_7a0._0_4_;
      uStack_bc = local_7a0._0_4_;
      uStack_b8 = local_7a0._0_4_;
      uStack_b4 = local_7a0._0_4_;
      uStack_b0 = local_7a0._0_4_;
      uStack_ac = local_7a0._0_4_;
      uStack_a8 = local_7a0._0_4_;
      uStack_a4 = local_7a0._0_4_;
      local_e0 = 1.0 / local_540;
      fStack_dc = local_e0;
      fStack_d8 = local_e0;
      fStack_d4 = local_e0;
      fStack_d0 = local_e0;
      fStack_cc = local_e0;
      fStack_c8 = local_e0;
      fStack_c4 = local_e0;
      local_540 = (float)local_560._0_4_;
      fStack_53c = (float)local_560._0_4_;
      fStack_538 = (float)local_560._0_4_;
      fStack_534 = (float)local_560._0_4_;
      uStack_530 = local_560._0_4_;
      uStack_52c = local_560._0_4_;
      uStack_528 = local_560._0_4_;
      uStack_524 = local_560._0_4_;
      local_560._4_4_ = local_570._0_4_;
      local_560._0_4_ = local_570._0_4_;
      local_560._8_4_ = local_570._0_4_;
      local_560._12_4_ = local_570._0_4_;
      uStack_550 = local_570._0_4_;
      uStack_54c = local_570._0_4_;
      uStack_548 = local_570._0_4_;
      uStack_544 = local_570._0_4_;
      fVar137 = (float)local_620;
      fVar136 = local_620._4_4_;
      fVar106 = (float)uStack_618;
      fVar108 = uStack_618._4_4_;
      fVar110 = (float)uStack_610;
      fVar111 = uStack_610._4_4_;
      fVar112 = (float)uStack_608;
      local_800 = auVar220;
      local_760 = uVar86;
      for (lVar80 = 8; local_780 = auVar135._0_32_, lVar80 < iVar77; lVar80 = lVar80 + 8) {
        auVar101 = *(undefined1 (*) [32])(bezier_basis0 + lVar80 * 4 + lVar85);
        auVar117 = *(undefined1 (*) [32])(lVar85 + 0x21fb768 + lVar80 * 4);
        auVar171 = *(undefined1 (*) [32])(lVar85 + 0x21fbbec + lVar80 * 4);
        pauVar1 = (undefined1 (*) [32])(lVar85 + 0x21fc070 + lVar80 * 4);
        fVar113 = *(float *)*pauVar1;
        fVar188 = *(float *)(*pauVar1 + 4);
        fVar191 = *(float *)(*pauVar1 + 8);
        fVar192 = *(float *)(*pauVar1 + 0xc);
        fVar200 = *(float *)(*pauVar1 + 0x10);
        fVar201 = *(float *)(*pauVar1 + 0x14);
        fVar202 = *(float *)(*pauVar1 + 0x18);
        auVar75 = *(undefined1 (*) [28])*pauVar1;
        auVar135._0_4_ = fVar113 * auVar150._0_4_;
        auVar135._4_4_ = fVar188 * auVar150._4_4_;
        auVar135._8_4_ = fVar191 * auVar150._8_4_;
        auVar135._12_4_ = fVar192 * auVar150._12_4_;
        auVar135._16_4_ = fVar200 * auVar150._16_4_;
        auVar135._20_4_ = fVar201 * auVar150._20_4_;
        auVar135._28_36_ = auVar215._28_36_;
        auVar135._24_4_ = fVar202 * auVar150._24_4_;
        auVar215._0_4_ = fVar137 * fVar113;
        auVar215._4_4_ = fVar136 * fVar188;
        auVar215._8_4_ = fVar106 * fVar191;
        auVar215._12_4_ = fVar108 * fVar192;
        auVar215._16_4_ = fVar110 * fVar200;
        auVar215._20_4_ = fVar111 * fVar201;
        auVar215._28_36_ = auVar150._28_36_;
        auVar215._24_4_ = fVar112 * fVar202;
        auVar206 = auVar207._0_32_;
        auVar10 = vfmadd231ps_fma(auVar135._0_32_,auVar171,auVar206);
        auVar11 = vfmadd231ps_fma(auVar215._0_32_,auVar171,local_6e0);
        auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar117,auVar195);
        auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar117,local_520);
        auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar101,auVar179);
        auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar101,local_5c0);
        auVar100 = *(undefined1 (*) [32])(bezier_basis1 + lVar80 * 4 + lVar85);
        auVar124 = *(undefined1 (*) [32])(lVar85 + 0x21fdb88 + lVar80 * 4);
        auVar199 = *(undefined1 (*) [32])(lVar85 + 0x21fe00c + lVar80 * 4);
        pfVar2 = (float *)(lVar85 + 0x21fe490 + lVar80 * 4);
        fVar224 = *pfVar2;
        fVar225 = pfVar2[1];
        fVar226 = pfVar2[2];
        fVar67 = pfVar2[3];
        fVar68 = pfVar2[4];
        fVar69 = pfVar2[5];
        fVar70 = pfVar2[6];
        auVar35._4_4_ = auVar150._4_4_ * fVar225;
        auVar35._0_4_ = auVar150._0_4_ * fVar224;
        auVar35._8_4_ = auVar150._8_4_ * fVar226;
        auVar35._12_4_ = auVar150._12_4_ * fVar67;
        auVar35._16_4_ = auVar150._16_4_ * fVar68;
        auVar35._20_4_ = auVar150._20_4_ * fVar69;
        auVar35._24_4_ = auVar150._24_4_ * fVar70;
        auVar35._28_4_ = auVar150._28_4_;
        auVar76._4_4_ = fVar136 * fVar225;
        auVar76._0_4_ = fVar137 * fVar224;
        auVar76._8_4_ = fVar106 * fVar226;
        auVar76._12_4_ = fVar108 * fVar67;
        auVar76._16_4_ = fVar110 * fVar68;
        auVar76._20_4_ = fVar111 * fVar69;
        auVar76._24_4_ = fVar112 * fVar70;
        auVar76._28_4_ = uVar84;
        auVar12 = vfmadd231ps_fma(auVar35,auVar199,auVar206);
        auVar189 = vfmadd231ps_fma(auVar76,auVar199,local_6e0);
        auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar124,auVar195);
        auVar189 = vfmadd231ps_fma(ZEXT1632(auVar189),auVar124,local_520);
        auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar100,auVar179);
        auVar189 = vfmadd231ps_fma(ZEXT1632(auVar189),auVar100,local_5c0);
        auVar127 = ZEXT1632(auVar12);
        local_720 = ZEXT1632(auVar10);
        local_460 = vsubps_avx(auVar127,local_720);
        local_700 = ZEXT1632(auVar11);
        auVar216 = ZEXT1632(auVar189);
        local_420 = vsubps_avx(auVar216,local_700);
        auVar36._4_4_ = local_460._4_4_ * auVar11._4_4_;
        auVar36._0_4_ = local_460._0_4_ * auVar11._0_4_;
        auVar36._8_4_ = local_460._8_4_ * auVar11._8_4_;
        auVar36._12_4_ = local_460._12_4_ * auVar11._12_4_;
        auVar36._16_4_ = local_460._16_4_ * 0.0;
        auVar36._20_4_ = local_460._20_4_ * 0.0;
        auVar36._24_4_ = local_460._24_4_ * 0.0;
        auVar36._28_4_ = local_5c0._28_4_;
        fVar137 = local_420._0_4_;
        auVar128._0_4_ = auVar10._0_4_ * fVar137;
        fVar136 = local_420._4_4_;
        auVar128._4_4_ = auVar10._4_4_ * fVar136;
        fVar106 = local_420._8_4_;
        auVar128._8_4_ = auVar10._8_4_ * fVar106;
        fVar108 = local_420._12_4_;
        auVar128._12_4_ = auVar10._12_4_ * fVar108;
        fVar110 = local_420._16_4_;
        auVar128._16_4_ = fVar110 * 0.0;
        fVar111 = local_420._20_4_;
        auVar128._20_4_ = fVar111 * 0.0;
        fVar112 = local_420._24_4_;
        auVar128._24_4_ = fVar112 * 0.0;
        auVar128._28_4_ = 0;
        auVar215 = ZEXT3264(auVar171);
        auVar95 = vsubps_avx(auVar36,auVar128);
        auVar37._4_4_ = fVar188 * (float)local_240._4_4_;
        auVar37._0_4_ = fVar113 * (float)local_240._0_4_;
        auVar37._8_4_ = fVar191 * fStack_238;
        auVar37._12_4_ = fVar192 * fStack_234;
        auVar37._16_4_ = fVar200 * fStack_230;
        auVar37._20_4_ = fVar201 * fStack_22c;
        auVar37._24_4_ = fVar202 * fStack_228;
        auVar37._28_4_ = local_5c0._28_4_;
        auVar10 = vfmadd231ps_fma(auVar37,auVar171,local_a0);
        auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),local_80,auVar117);
        auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),local_220,auVar101);
        auVar38._4_4_ = (float)local_240._4_4_ * fVar225;
        auVar38._0_4_ = (float)local_240._0_4_ * fVar224;
        auVar38._8_4_ = fStack_238 * fVar226;
        auVar38._12_4_ = fStack_234 * fVar67;
        auVar38._16_4_ = fStack_230 * fVar68;
        auVar38._20_4_ = fStack_22c * fVar69;
        auVar38._24_4_ = fStack_228 * fVar70;
        auVar38._28_4_ = uStack_224;
        auVar11 = vfmadd231ps_fma(auVar38,auVar199,local_a0);
        auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar124,local_80);
        auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar100,local_220);
        auVar39._4_4_ = fVar136 * fVar136;
        auVar39._0_4_ = fVar137 * fVar137;
        auVar39._8_4_ = fVar106 * fVar106;
        auVar39._12_4_ = fVar108 * fVar108;
        auVar39._16_4_ = fVar110 * fVar110;
        auVar39._20_4_ = fVar111 * fVar111;
        auVar39._24_4_ = fVar112 * fVar112;
        auVar39._28_4_ = local_220._28_4_;
        auVar12 = vfmadd231ps_fma(auVar39,local_460,local_460);
        auVar173 = vmaxps_avx(ZEXT1632(auVar10),ZEXT1632(auVar11));
        auVar196._0_4_ = auVar173._0_4_ * auVar173._0_4_ * auVar12._0_4_;
        auVar196._4_4_ = auVar173._4_4_ * auVar173._4_4_ * auVar12._4_4_;
        auVar196._8_4_ = auVar173._8_4_ * auVar173._8_4_ * auVar12._8_4_;
        auVar196._12_4_ = auVar173._12_4_ * auVar173._12_4_ * auVar12._12_4_;
        auVar196._16_4_ = auVar173._16_4_ * auVar173._16_4_ * 0.0;
        auVar196._20_4_ = auVar173._20_4_ * auVar173._20_4_ * 0.0;
        auVar196._24_4_ = auVar173._24_4_ * auVar173._24_4_ * 0.0;
        auVar196._28_4_ = 0;
        auVar40._4_4_ = auVar95._4_4_ * auVar95._4_4_;
        auVar40._0_4_ = auVar95._0_4_ * auVar95._0_4_;
        auVar40._8_4_ = auVar95._8_4_ * auVar95._8_4_;
        auVar40._12_4_ = auVar95._12_4_ * auVar95._12_4_;
        auVar40._16_4_ = auVar95._16_4_ * auVar95._16_4_;
        auVar40._20_4_ = auVar95._20_4_ * auVar95._20_4_;
        auVar40._24_4_ = auVar95._24_4_ * auVar95._24_4_;
        auVar40._28_4_ = auVar95._28_4_;
        auVar173 = vcmpps_avx(auVar40,auVar196,2);
        local_380 = (int)lVar80;
        auVar197._4_4_ = local_380;
        auVar197._0_4_ = local_380;
        auVar197._8_4_ = local_380;
        auVar197._12_4_ = local_380;
        auVar197._16_4_ = local_380;
        auVar197._20_4_ = local_380;
        auVar197._24_4_ = local_380;
        auVar197._28_4_ = local_380;
        auVar95 = vpor_avx2(auVar197,_DAT_01fb4ba0);
        auVar14 = vpcmpgtd_avx2(local_480,auVar95);
        auVar95 = auVar14 & auVar173;
        fVar137 = (float)local_620;
        fVar136 = local_620._4_4_;
        fVar106 = (float)uStack_618;
        fVar108 = uStack_618._4_4_;
        fVar110 = (float)uStack_610;
        fVar111 = uStack_610._4_4_;
        fVar112 = (float)uStack_608;
        if ((((((((auVar95 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar95 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar95 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar95 >> 0x7f,0) == '\0') &&
              (auVar95 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar95 >> 0xbf,0) == '\0') &&
            (auVar95 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar95[0x1f]) {
          auVar135 = ZEXT3264(local_780);
          auVar207 = ZEXT3264(auVar206);
          auVar150 = ZEXT3264(CONCAT428(fStack_724,
                                        CONCAT424(fStack_728,
                                                  CONCAT420(fStack_72c,
                                                            CONCAT416(fStack_730,
                                                                      CONCAT412(fStack_734,
                                                                                CONCAT48(fStack_738,
                                                                                         CONCAT44(
                                                  fStack_73c,local_740))))))));
        }
        else {
          _local_4a0 = vandps_avx(auVar14,auVar173);
          auVar41._4_4_ = local_760._4_4_ * fVar225;
          auVar41._0_4_ = (float)local_760 * fVar224;
          auVar41._8_4_ = (float)uStack_758 * fVar226;
          auVar41._12_4_ = uStack_758._4_4_ * fVar67;
          auVar41._16_4_ = (float)uStack_750 * fVar68;
          auVar41._20_4_ = uStack_750._4_4_ * fVar69;
          auVar41._24_4_ = (float)uStack_748 * fVar70;
          auVar41._28_4_ = local_4a0._28_4_;
          auVar72._8_8_ = uStack_598;
          auVar72._0_8_ = local_5a0;
          auVar72._16_8_ = uStack_590;
          auVar72._24_8_ = uStack_588;
          auVar12 = vfmadd213ps_fma(auVar199,auVar72,auVar41);
          auVar12 = vfmadd213ps_fma(auVar124,local_260,ZEXT1632(auVar12));
          auVar12 = vfmadd213ps_fma(auVar100,local_800,ZEXT1632(auVar12));
          local_440._0_4_ = auVar75._0_4_;
          local_440._4_4_ = auVar75._4_4_;
          fStack_438 = auVar75._8_4_;
          fStack_434 = auVar75._12_4_;
          fStack_430 = auVar75._16_4_;
          fStack_42c = auVar75._20_4_;
          fStack_428 = auVar75._24_4_;
          auVar42._4_4_ = local_760._4_4_ * (float)local_440._4_4_;
          auVar42._0_4_ = (float)local_760 * (float)local_440._0_4_;
          auVar42._8_4_ = (float)uStack_758 * fStack_438;
          auVar42._12_4_ = uStack_758._4_4_ * fStack_434;
          auVar42._16_4_ = (float)uStack_750 * fStack_430;
          auVar42._20_4_ = uStack_750._4_4_ * fStack_42c;
          auVar42._24_4_ = (float)uStack_748 * fStack_428;
          auVar42._28_4_ = local_4a0._28_4_;
          auVar189 = vfmadd213ps_fma(auVar171,auVar72,auVar42);
          auVar189 = vfmadd213ps_fma(auVar117,local_260,ZEXT1632(auVar189));
          auVar117 = *(undefined1 (*) [32])(lVar85 + 0x21fc4f4 + lVar80 * 4);
          auVar171 = *(undefined1 (*) [32])(lVar85 + 0x21fc978 + lVar80 * 4);
          auVar100 = *(undefined1 (*) [32])(lVar85 + 0x21fcdfc + lVar80 * 4);
          pfVar2 = (float *)(lVar85 + 0x21fd280 + lVar80 * 4);
          fVar113 = *pfVar2;
          fVar188 = pfVar2[1];
          fVar191 = pfVar2[2];
          fVar192 = pfVar2[3];
          fVar200 = pfVar2[4];
          fVar201 = pfVar2[5];
          fVar202 = pfVar2[6];
          auVar43._4_4_ = fVar188 * fStack_73c;
          auVar43._0_4_ = fVar113 * local_740;
          auVar43._8_4_ = fVar191 * fStack_738;
          auVar43._12_4_ = fVar192 * fStack_734;
          auVar43._16_4_ = fVar200 * fStack_730;
          auVar43._20_4_ = fVar201 * fStack_72c;
          auVar43._24_4_ = fVar202 * fStack_728;
          auVar43._28_4_ = (int)((ulong)uStack_588 >> 0x20);
          auVar213._0_4_ = (float)local_620 * fVar113;
          auVar213._4_4_ = local_620._4_4_ * fVar188;
          auVar213._8_4_ = (float)uStack_618 * fVar191;
          auVar213._12_4_ = uStack_618._4_4_ * fVar192;
          auVar213._16_4_ = (float)uStack_610 * fVar200;
          auVar213._20_4_ = uStack_610._4_4_ * fVar201;
          auVar213._24_4_ = (float)uStack_608 * fVar202;
          auVar213._28_4_ = 0;
          auVar44._4_4_ = fVar188 * local_760._4_4_;
          auVar44._0_4_ = fVar113 * (float)local_760;
          auVar44._8_4_ = fVar191 * (float)uStack_758;
          auVar44._12_4_ = fVar192 * uStack_758._4_4_;
          auVar44._16_4_ = fVar200 * (float)uStack_750;
          auVar44._20_4_ = fVar201 * uStack_750._4_4_;
          auVar44._24_4_ = fVar202 * (float)uStack_748;
          auVar44._28_4_ = pfVar2[7];
          auVar13 = vfmadd231ps_fma(auVar43,auVar100,auVar206);
          auVar90 = vfmadd231ps_fma(auVar213,auVar100,local_6e0);
          auVar138 = vfmadd231ps_fma(auVar44,auVar72,auVar100);
          auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar171,auVar195);
          auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar171,local_520);
          auVar138 = vfmadd231ps_fma(ZEXT1632(auVar138),local_260,auVar171);
          auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar117,auVar179);
          auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar117,local_5c0);
          auVar138 = vfmadd231ps_fma(ZEXT1632(auVar138),local_800,auVar117);
          pfVar2 = (float *)(lVar85 + 0x21ff6a0 + lVar80 * 4);
          fVar113 = *pfVar2;
          fVar188 = pfVar2[1];
          fVar191 = pfVar2[2];
          fVar192 = pfVar2[3];
          fVar200 = pfVar2[4];
          fVar201 = pfVar2[5];
          fVar202 = pfVar2[6];
          auVar45._4_4_ = fStack_73c * fVar188;
          auVar45._0_4_ = local_740 * fVar113;
          auVar45._8_4_ = fStack_738 * fVar191;
          auVar45._12_4_ = fStack_734 * fVar192;
          auVar45._16_4_ = fStack_730 * fVar200;
          auVar45._20_4_ = fStack_72c * fVar201;
          auVar45._24_4_ = fStack_728 * fVar202;
          auVar45._28_4_ = uStack_608._4_4_;
          auVar46._4_4_ = local_620._4_4_ * fVar188;
          auVar46._0_4_ = (float)local_620 * fVar113;
          auVar46._8_4_ = (float)uStack_618 * fVar191;
          auVar46._12_4_ = uStack_618._4_4_ * fVar192;
          auVar46._16_4_ = (float)uStack_610 * fVar200;
          auVar46._20_4_ = uStack_610._4_4_ * fVar201;
          auVar46._24_4_ = (float)uStack_608 * fVar202;
          auVar46._28_4_ = local_800._28_4_;
          auVar47._4_4_ = fVar188 * local_760._4_4_;
          auVar47._0_4_ = fVar113 * (float)local_760;
          auVar47._8_4_ = fVar191 * (float)uStack_758;
          auVar47._12_4_ = fVar192 * uStack_758._4_4_;
          auVar47._16_4_ = fVar200 * (float)uStack_750;
          auVar47._20_4_ = fVar201 * uStack_750._4_4_;
          auVar47._24_4_ = fVar202 * (float)uStack_748;
          auVar47._28_4_ = pfVar2[7];
          auVar117 = *(undefined1 (*) [32])(lVar85 + 0x21ff21c + lVar80 * 4);
          auVar115 = vfmadd231ps_fma(auVar45,auVar117,auVar206);
          auVar88 = vfmadd231ps_fma(auVar46,auVar117,local_6e0);
          auVar73._8_8_ = uStack_598;
          auVar73._0_8_ = local_5a0;
          auVar73._16_8_ = uStack_590;
          auVar73._24_8_ = uStack_588;
          auVar116 = vfmadd231ps_fma(auVar47,auVar117,auVar73);
          auVar117 = *(undefined1 (*) [32])(lVar85 + 0x21fed98 + lVar80 * 4);
          auVar115 = vfmadd231ps_fma(ZEXT1632(auVar115),auVar117,auVar195);
          auVar88 = vfmadd231ps_fma(ZEXT1632(auVar88),auVar117,local_520);
          auVar116 = vfmadd231ps_fma(ZEXT1632(auVar116),auVar117,local_260);
          auVar117 = *(undefined1 (*) [32])(lVar85 + 0x21fe914 + lVar80 * 4);
          auVar115 = vfmadd231ps_fma(ZEXT1632(auVar115),auVar117,auVar179);
          auVar88 = vfmadd231ps_fma(ZEXT1632(auVar88),auVar117,local_5c0);
          auVar116 = vfmadd231ps_fma(ZEXT1632(auVar116),local_800,auVar117);
          auVar198._8_4_ = 0x7fffffff;
          auVar198._0_8_ = 0x7fffffff7fffffff;
          auVar198._12_4_ = 0x7fffffff;
          auVar198._16_4_ = 0x7fffffff;
          auVar198._20_4_ = 0x7fffffff;
          auVar198._24_4_ = 0x7fffffff;
          auVar198._28_4_ = 0x7fffffff;
          auVar117 = vandps_avx(ZEXT1632(auVar13),auVar198);
          auVar171 = vandps_avx(ZEXT1632(auVar90),auVar198);
          auVar171 = vmaxps_avx(auVar117,auVar171);
          auVar117 = vandps_avx(ZEXT1632(auVar138),auVar198);
          auVar117 = vmaxps_avx(auVar171,auVar117);
          auVar117 = vcmpps_avx(auVar117,_local_4c0,1);
          auVar100 = vblendvps_avx(ZEXT1632(auVar13),local_460,auVar117);
          auVar124 = vblendvps_avx(ZEXT1632(auVar90),local_420,auVar117);
          auVar117 = vandps_avx(ZEXT1632(auVar115),auVar198);
          auVar171 = vandps_avx(ZEXT1632(auVar88),auVar198);
          auVar171 = vmaxps_avx(auVar117,auVar171);
          auVar117 = vandps_avx(auVar198,ZEXT1632(auVar116));
          auVar117 = vmaxps_avx(auVar171,auVar117);
          auVar171 = vcmpps_avx(auVar117,_local_4c0,1);
          auVar117 = vblendvps_avx(ZEXT1632(auVar115),local_460,auVar171);
          auVar171 = vblendvps_avx(ZEXT1632(auVar88),local_420,auVar171);
          auVar189 = vfmadd213ps_fma(auVar101,local_800,ZEXT1632(auVar189));
          auVar13 = vfmadd213ps_fma(auVar100,auVar100,ZEXT832(0) << 0x20);
          auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar124,auVar124);
          auVar101 = vrsqrtps_avx(ZEXT1632(auVar13));
          fVar113 = auVar101._0_4_;
          fVar188 = auVar101._4_4_;
          fVar191 = auVar101._8_4_;
          fVar192 = auVar101._12_4_;
          fVar200 = auVar101._16_4_;
          fVar201 = auVar101._20_4_;
          fVar202 = auVar101._24_4_;
          auVar48._4_4_ = fVar188 * fVar188 * fVar188 * auVar13._4_4_ * -0.5;
          auVar48._0_4_ = fVar113 * fVar113 * fVar113 * auVar13._0_4_ * -0.5;
          auVar48._8_4_ = fVar191 * fVar191 * fVar191 * auVar13._8_4_ * -0.5;
          auVar48._12_4_ = fVar192 * fVar192 * fVar192 * auVar13._12_4_ * -0.5;
          auVar48._16_4_ = fVar200 * fVar200 * fVar200 * -0.0;
          auVar48._20_4_ = fVar201 * fVar201 * fVar201 * -0.0;
          auVar48._24_4_ = fVar202 * fVar202 * fVar202 * -0.0;
          auVar48._28_4_ = 0;
          auVar222._8_4_ = 0x3fc00000;
          auVar222._0_8_ = 0x3fc000003fc00000;
          auVar222._12_4_ = 0x3fc00000;
          auVar222._16_4_ = 0x3fc00000;
          auVar222._20_4_ = 0x3fc00000;
          auVar222._24_4_ = 0x3fc00000;
          auVar222._28_4_ = 0x3fc00000;
          auVar13 = vfmadd231ps_fma(auVar48,auVar222,auVar101);
          fVar113 = auVar13._0_4_;
          fVar188 = auVar13._4_4_;
          auVar49._4_4_ = auVar124._4_4_ * fVar188;
          auVar49._0_4_ = auVar124._0_4_ * fVar113;
          fVar191 = auVar13._8_4_;
          auVar49._8_4_ = auVar124._8_4_ * fVar191;
          fVar192 = auVar13._12_4_;
          auVar49._12_4_ = auVar124._12_4_ * fVar192;
          auVar49._16_4_ = auVar124._16_4_ * 0.0;
          auVar49._20_4_ = auVar124._20_4_ * 0.0;
          auVar49._24_4_ = auVar124._24_4_ * 0.0;
          auVar49._28_4_ = auVar101._28_4_;
          auVar50._4_4_ = fVar188 * -auVar100._4_4_;
          auVar50._0_4_ = fVar113 * -auVar100._0_4_;
          auVar50._8_4_ = fVar191 * -auVar100._8_4_;
          auVar50._12_4_ = fVar192 * -auVar100._12_4_;
          auVar50._16_4_ = -auVar100._16_4_ * 0.0;
          auVar50._20_4_ = -auVar100._20_4_ * 0.0;
          auVar50._24_4_ = -auVar100._24_4_ * 0.0;
          auVar50._28_4_ = auVar124._28_4_;
          auVar13 = vfmadd213ps_fma(auVar117,auVar117,ZEXT832(0) << 0x20);
          auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar171,auVar171);
          auVar101 = vrsqrtps_avx(ZEXT1632(auVar13));
          auVar51._28_4_ = auVar179._0_4_;
          auVar51._0_28_ =
               ZEXT1628(CONCAT412(fVar192 * 0.0,
                                  CONCAT48(fVar191 * 0.0,CONCAT44(fVar188 * 0.0,fVar113 * 0.0))));
          fVar113 = auVar101._0_4_;
          fVar188 = auVar101._4_4_;
          fVar191 = auVar101._8_4_;
          fVar192 = auVar101._12_4_;
          fVar200 = auVar101._16_4_;
          fVar201 = auVar101._20_4_;
          fVar202 = auVar101._24_4_;
          auVar52._4_4_ = fVar188 * fVar188 * fVar188 * auVar13._4_4_ * -0.5;
          auVar52._0_4_ = fVar113 * fVar113 * fVar113 * auVar13._0_4_ * -0.5;
          auVar52._8_4_ = fVar191 * fVar191 * fVar191 * auVar13._8_4_ * -0.5;
          auVar52._12_4_ = fVar192 * fVar192 * fVar192 * auVar13._12_4_ * -0.5;
          auVar52._16_4_ = fVar200 * fVar200 * fVar200 * -0.0;
          auVar52._20_4_ = fVar201 * fVar201 * fVar201 * -0.0;
          auVar52._24_4_ = fVar202 * fVar202 * fVar202 * -0.0;
          auVar52._28_4_ = 0;
          auVar13 = vfmadd231ps_fma(auVar52,auVar222,auVar101);
          fVar113 = auVar13._0_4_;
          auVar217._0_4_ = auVar171._0_4_ * fVar113;
          fVar188 = auVar13._4_4_;
          auVar217._4_4_ = auVar171._4_4_ * fVar188;
          fVar191 = auVar13._8_4_;
          auVar217._8_4_ = auVar171._8_4_ * fVar191;
          fVar192 = auVar13._12_4_;
          auVar217._12_4_ = auVar171._12_4_ * fVar192;
          auVar217._16_4_ = auVar171._16_4_ * 0.0;
          auVar217._20_4_ = auVar171._20_4_ * 0.0;
          auVar217._24_4_ = auVar171._24_4_ * 0.0;
          auVar217._28_4_ = 0;
          auVar53._4_4_ = fVar188 * -auVar117._4_4_;
          auVar53._0_4_ = fVar113 * -auVar117._0_4_;
          auVar53._8_4_ = fVar191 * -auVar117._8_4_;
          auVar53._12_4_ = fVar192 * -auVar117._12_4_;
          auVar53._16_4_ = -auVar117._16_4_ * 0.0;
          auVar53._20_4_ = -auVar117._20_4_ * 0.0;
          auVar53._24_4_ = -auVar117._24_4_ * 0.0;
          auVar53._28_4_ = auVar101._28_4_;
          auVar54._28_4_ = 0xbf000000;
          auVar54._0_28_ =
               ZEXT1628(CONCAT412(fVar192 * 0.0,
                                  CONCAT48(fVar191 * 0.0,CONCAT44(fVar188 * 0.0,fVar113 * 0.0))));
          auVar13 = vfmadd213ps_fma(auVar49,ZEXT1632(auVar10),local_720);
          auVar101 = ZEXT1632(auVar10);
          auVar90 = vfmadd213ps_fma(auVar50,auVar101,local_700);
          auVar138 = vfmadd213ps_fma(auVar51,auVar101,ZEXT1632(auVar189));
          auVar116 = vfnmadd213ps_fma(auVar49,auVar101,local_720);
          auVar115 = vfmadd213ps_fma(auVar217,ZEXT1632(auVar11),auVar127);
          auVar158 = vfnmadd213ps_fma(auVar50,auVar101,local_700);
          auVar101 = ZEXT1632(auVar11);
          auVar88 = vfmadd213ps_fma(auVar53,auVar101,auVar216);
          auVar102 = ZEXT1632(auVar10);
          auVar10 = vfnmadd231ps_fma(ZEXT1632(auVar189),auVar102,auVar51);
          auVar189 = vfmadd213ps_fma(auVar54,auVar101,ZEXT1632(auVar12));
          auVar87 = vfnmadd213ps_fma(auVar217,auVar101,auVar127);
          auVar114 = vfnmadd213ps_fma(auVar53,auVar101,auVar216);
          auVar157 = vfnmadd231ps_fma(ZEXT1632(auVar12),ZEXT1632(auVar11),auVar54);
          auVar101 = vsubps_avx(ZEXT1632(auVar88),ZEXT1632(auVar158));
          auVar117 = vsubps_avx(ZEXT1632(auVar189),ZEXT1632(auVar10));
          auVar181._0_4_ = auVar101._0_4_ * auVar10._0_4_;
          auVar181._4_4_ = auVar101._4_4_ * auVar10._4_4_;
          auVar181._8_4_ = auVar101._8_4_ * auVar10._8_4_;
          auVar181._12_4_ = auVar101._12_4_ * auVar10._12_4_;
          auVar181._16_4_ = auVar101._16_4_ * 0.0;
          auVar181._20_4_ = auVar101._20_4_ * 0.0;
          auVar181._24_4_ = auVar101._24_4_ * 0.0;
          auVar181._28_4_ = 0;
          auVar12 = vfmsub231ps_fma(auVar181,ZEXT1632(auVar158),auVar117);
          auVar55._4_4_ = auVar116._4_4_ * auVar117._4_4_;
          auVar55._0_4_ = auVar116._0_4_ * auVar117._0_4_;
          auVar55._8_4_ = auVar116._8_4_ * auVar117._8_4_;
          auVar55._12_4_ = auVar116._12_4_ * auVar117._12_4_;
          auVar55._16_4_ = auVar117._16_4_ * 0.0;
          auVar55._20_4_ = auVar117._20_4_ * 0.0;
          auVar55._24_4_ = auVar117._24_4_ * 0.0;
          auVar55._28_4_ = auVar117._28_4_;
          auVar199 = ZEXT1632(auVar116);
          auVar117 = vsubps_avx(ZEXT1632(auVar115),auVar199);
          auVar95 = ZEXT1632(auVar10);
          auVar10 = vfmsub231ps_fma(auVar55,auVar95,auVar117);
          auVar56._4_4_ = auVar158._4_4_ * auVar117._4_4_;
          auVar56._0_4_ = auVar158._0_4_ * auVar117._0_4_;
          auVar56._8_4_ = auVar158._8_4_ * auVar117._8_4_;
          auVar56._12_4_ = auVar158._12_4_ * auVar117._12_4_;
          auVar56._16_4_ = auVar117._16_4_ * 0.0;
          auVar56._20_4_ = auVar117._20_4_ * 0.0;
          auVar56._24_4_ = auVar117._24_4_ * 0.0;
          auVar56._28_4_ = auVar117._28_4_;
          auVar116 = vfmsub231ps_fma(auVar56,auVar199,auVar101);
          auVar101 = ZEXT1232(ZEXT412(0)) << 0x20;
          auVar10 = vfmadd231ps_fma(ZEXT1632(auVar116),auVar101,ZEXT1632(auVar10));
          auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar101,ZEXT1632(auVar12));
          auVar14 = vcmpps_avx(ZEXT1632(auVar10),ZEXT1232(ZEXT412(0)) << 0x20,2);
          auVar101 = vblendvps_avx(ZEXT1632(auVar87),ZEXT1632(auVar13),auVar14);
          local_7a0 = vblendvps_avx(ZEXT1632(auVar114),ZEXT1632(auVar90),auVar14);
          auVar117 = vblendvps_avx(ZEXT1632(auVar157),ZEXT1632(auVar138),auVar14);
          auVar171 = vblendvps_avx(auVar199,ZEXT1632(auVar115),auVar14);
          auVar100 = vblendvps_avx(ZEXT1632(auVar158),ZEXT1632(auVar88),auVar14);
          auVar124 = vblendvps_avx(auVar95,ZEXT1632(auVar189),auVar14);
          auVar199 = vblendvps_avx(ZEXT1632(auVar115),auVar199,auVar14);
          auVar173 = vblendvps_avx(ZEXT1632(auVar88),ZEXT1632(auVar158),auVar14);
          auVar10 = vpackssdw_avx(local_4a0._0_16_,local_4a0._16_16_);
          auVar95 = vblendvps_avx(ZEXT1632(auVar189),auVar95,auVar14);
          auVar199 = vsubps_avx(auVar199,auVar101);
          auVar173 = vsubps_avx(auVar173,local_7a0);
          auVar127 = vsubps_avx(auVar95,auVar117);
          auVar206 = vsubps_avx(auVar101,auVar171);
          auVar216 = vsubps_avx(local_7a0,auVar100);
          auVar94 = vsubps_avx(auVar117,auVar124);
          auVar174._0_4_ = auVar101._0_4_ * auVar127._0_4_;
          auVar174._4_4_ = auVar101._4_4_ * auVar127._4_4_;
          auVar174._8_4_ = auVar101._8_4_ * auVar127._8_4_;
          auVar174._12_4_ = auVar101._12_4_ * auVar127._12_4_;
          auVar174._16_4_ = auVar101._16_4_ * auVar127._16_4_;
          auVar174._20_4_ = auVar101._20_4_ * auVar127._20_4_;
          auVar174._24_4_ = auVar101._24_4_ * auVar127._24_4_;
          auVar174._28_4_ = 0;
          auVar12 = vfmsub231ps_fma(auVar174,auVar117,auVar199);
          auVar57._4_4_ = auVar199._4_4_ * local_7a0._4_4_;
          auVar57._0_4_ = auVar199._0_4_ * local_7a0._0_4_;
          auVar57._8_4_ = auVar199._8_4_ * local_7a0._8_4_;
          auVar57._12_4_ = auVar199._12_4_ * local_7a0._12_4_;
          auVar57._16_4_ = auVar199._16_4_ * local_7a0._16_4_;
          auVar57._20_4_ = auVar199._20_4_ * local_7a0._20_4_;
          auVar57._24_4_ = auVar199._24_4_ * local_7a0._24_4_;
          auVar57._28_4_ = auVar95._28_4_;
          auVar13 = vfmsub231ps_fma(auVar57,auVar101,auVar173);
          auVar189 = ZEXT816(0) << 0x20;
          auVar12 = vfmadd231ps_fma(ZEXT1632(auVar13),ZEXT832(0) << 0x20,ZEXT1632(auVar12));
          auVar175._0_4_ = auVar173._0_4_ * auVar117._0_4_;
          auVar175._4_4_ = auVar173._4_4_ * auVar117._4_4_;
          auVar175._8_4_ = auVar173._8_4_ * auVar117._8_4_;
          auVar175._12_4_ = auVar173._12_4_ * auVar117._12_4_;
          auVar175._16_4_ = auVar173._16_4_ * auVar117._16_4_;
          auVar175._20_4_ = auVar173._20_4_ * auVar117._20_4_;
          auVar175._24_4_ = auVar173._24_4_ * auVar117._24_4_;
          auVar175._28_4_ = 0;
          auVar13 = vfmsub231ps_fma(auVar175,local_7a0,auVar127);
          auVar13 = vfmadd231ps_fma(ZEXT1632(auVar12),ZEXT832(0) << 0x20,ZEXT1632(auVar13));
          auVar215 = ZEXT3264(auVar171);
          auVar176._0_4_ = auVar94._0_4_ * auVar171._0_4_;
          auVar176._4_4_ = auVar94._4_4_ * auVar171._4_4_;
          auVar176._8_4_ = auVar94._8_4_ * auVar171._8_4_;
          auVar176._12_4_ = auVar94._12_4_ * auVar171._12_4_;
          auVar176._16_4_ = auVar94._16_4_ * auVar171._16_4_;
          auVar176._20_4_ = auVar94._20_4_ * auVar171._20_4_;
          auVar176._24_4_ = auVar94._24_4_ * auVar171._24_4_;
          auVar176._28_4_ = 0;
          auVar12 = vfmsub231ps_fma(auVar176,auVar206,auVar124);
          auVar58._4_4_ = auVar216._4_4_ * auVar124._4_4_;
          auVar58._0_4_ = auVar216._0_4_ * auVar124._0_4_;
          auVar58._8_4_ = auVar216._8_4_ * auVar124._8_4_;
          auVar58._12_4_ = auVar216._12_4_ * auVar124._12_4_;
          auVar58._16_4_ = auVar216._16_4_ * auVar124._16_4_;
          auVar58._20_4_ = auVar216._20_4_ * auVar124._20_4_;
          auVar58._24_4_ = auVar216._24_4_ * auVar124._24_4_;
          auVar58._28_4_ = auVar124._28_4_;
          auVar90 = vfmsub231ps_fma(auVar58,auVar100,auVar94);
          auVar59._4_4_ = auVar206._4_4_ * auVar100._4_4_;
          auVar59._0_4_ = auVar206._0_4_ * auVar100._0_4_;
          auVar59._8_4_ = auVar206._8_4_ * auVar100._8_4_;
          auVar59._12_4_ = auVar206._12_4_ * auVar100._12_4_;
          auVar59._16_4_ = auVar206._16_4_ * auVar100._16_4_;
          auVar59._20_4_ = auVar206._20_4_ * auVar100._20_4_;
          auVar59._24_4_ = auVar206._24_4_ * auVar100._24_4_;
          auVar59._28_4_ = auVar100._28_4_;
          auVar138 = vfmsub231ps_fma(auVar59,auVar216,auVar171);
          auVar100 = ZEXT832(0) << 0x20;
          auVar12 = vfmadd231ps_fma(ZEXT1632(auVar138),auVar100,ZEXT1632(auVar12));
          auVar90 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar100,ZEXT1632(auVar90));
          auVar171 = vmaxps_avx(ZEXT1632(auVar13),ZEXT1632(auVar90));
          auVar171 = vcmpps_avx(auVar171,ZEXT832(0) << 0x20,2);
          auVar12 = vpackssdw_avx(auVar171._0_16_,auVar171._16_16_);
          auVar10 = vpand_avx(auVar12,auVar10);
          auVar171 = vpmovsxwd_avx2(auVar10);
          if ((((((((auVar171 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar171 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar171 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar171 >> 0x7f,0) == '\0') &&
                (auVar171 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar171 >> 0xbf,0) == '\0') &&
              (auVar171 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar171[0x1f]) {
LAB_01153d57:
            auVar156._8_8_ = uStack_658;
            auVar156._0_8_ = local_660;
            auVar156._16_8_ = uStack_650;
            auVar156._24_8_ = uStack_648;
            auVar190 = ZEXT1632(auVar189);
          }
          else {
            auVar60._4_4_ = auVar173._4_4_ * auVar94._4_4_;
            auVar60._0_4_ = auVar173._0_4_ * auVar94._0_4_;
            auVar60._8_4_ = auVar173._8_4_ * auVar94._8_4_;
            auVar60._12_4_ = auVar173._12_4_ * auVar94._12_4_;
            auVar60._16_4_ = auVar173._16_4_ * auVar94._16_4_;
            auVar60._20_4_ = auVar173._20_4_ * auVar94._20_4_;
            auVar60._24_4_ = auVar173._24_4_ * auVar94._24_4_;
            auVar60._28_4_ = auVar171._28_4_;
            auVar115 = vfmsub231ps_fma(auVar60,auVar216,auVar127);
            auVar182._0_4_ = auVar206._0_4_ * auVar127._0_4_;
            auVar182._4_4_ = auVar206._4_4_ * auVar127._4_4_;
            auVar182._8_4_ = auVar206._8_4_ * auVar127._8_4_;
            auVar182._12_4_ = auVar206._12_4_ * auVar127._12_4_;
            auVar182._16_4_ = auVar206._16_4_ * auVar127._16_4_;
            auVar182._20_4_ = auVar206._20_4_ * auVar127._20_4_;
            auVar182._24_4_ = auVar206._24_4_ * auVar127._24_4_;
            auVar182._28_4_ = 0;
            auVar88 = vfmsub231ps_fma(auVar182,auVar199,auVar94);
            auVar61._4_4_ = auVar199._4_4_ * auVar216._4_4_;
            auVar61._0_4_ = auVar199._0_4_ * auVar216._0_4_;
            auVar61._8_4_ = auVar199._8_4_ * auVar216._8_4_;
            auVar61._12_4_ = auVar199._12_4_ * auVar216._12_4_;
            auVar61._16_4_ = auVar199._16_4_ * auVar216._16_4_;
            auVar61._20_4_ = auVar199._20_4_ * auVar216._20_4_;
            auVar61._24_4_ = auVar199._24_4_ * auVar216._24_4_;
            auVar61._28_4_ = auVar216._28_4_;
            auVar116 = vfmsub231ps_fma(auVar61,auVar206,auVar173);
            auVar12 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar88),ZEXT1632(auVar116));
            auVar138 = vfmadd231ps_fma(ZEXT1632(auVar12),ZEXT1632(auVar115),auVar100);
            auVar171 = vrcpps_avx(ZEXT1632(auVar138));
            auVar214._8_4_ = 0x3f800000;
            auVar214._0_8_ = 0x3f8000003f800000;
            auVar214._12_4_ = 0x3f800000;
            auVar214._16_4_ = 0x3f800000;
            auVar214._20_4_ = 0x3f800000;
            auVar214._24_4_ = 0x3f800000;
            auVar214._28_4_ = 0x3f800000;
            auVar215 = ZEXT3264(auVar214);
            auVar12 = vfnmadd213ps_fma(auVar171,ZEXT1632(auVar138),auVar214);
            auVar189 = vfmadd132ps_fma(ZEXT1632(auVar12),auVar171,auVar171);
            auVar190 = ZEXT1632(auVar189);
            auVar62._4_4_ = auVar116._4_4_ * auVar117._4_4_;
            auVar62._0_4_ = auVar116._0_4_ * auVar117._0_4_;
            auVar62._8_4_ = auVar116._8_4_ * auVar117._8_4_;
            auVar62._12_4_ = auVar116._12_4_ * auVar117._12_4_;
            auVar62._16_4_ = auVar117._16_4_ * 0.0;
            auVar62._20_4_ = auVar117._20_4_ * 0.0;
            auVar62._24_4_ = auVar117._24_4_ * 0.0;
            auVar62._28_4_ = auVar127._28_4_;
            auVar12 = vfmadd231ps_fma(auVar62,ZEXT1632(auVar88),local_7a0);
            auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),ZEXT1632(auVar115),auVar101);
            fVar113 = auVar189._0_4_;
            fVar188 = auVar189._4_4_;
            fVar191 = auVar189._8_4_;
            fVar192 = auVar189._12_4_;
            auVar171 = ZEXT1632(CONCAT412(fVar192 * auVar12._12_4_,
                                          CONCAT48(fVar191 * auVar12._8_4_,
                                                   CONCAT44(fVar188 * auVar12._4_4_,
                                                            fVar113 * auVar12._0_4_))));
            uVar208 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar155._4_4_ = uVar208;
            auVar155._0_4_ = uVar208;
            auVar155._8_4_ = uVar208;
            auVar155._12_4_ = uVar208;
            auVar155._16_4_ = uVar208;
            auVar155._20_4_ = uVar208;
            auVar155._24_4_ = uVar208;
            auVar155._28_4_ = uVar208;
            auVar74._4_4_ = uStack_bc;
            auVar74._0_4_ = local_c0;
            auVar74._8_4_ = uStack_b8;
            auVar74._12_4_ = uStack_b4;
            auVar74._16_4_ = uStack_b0;
            auVar74._20_4_ = uStack_ac;
            auVar74._24_4_ = uStack_a8;
            auVar74._28_4_ = uStack_a4;
            auVar101 = vcmpps_avx(auVar74,auVar171,2);
            auVar117 = vcmpps_avx(auVar171,auVar155,2);
            auVar101 = vandps_avx(auVar117,auVar101);
            auVar12 = vpackssdw_avx(auVar101._0_16_,auVar101._16_16_);
            auVar10 = vpand_avx(auVar10,auVar12);
            auVar101 = vpmovsxwd_avx2(auVar10);
            if ((((((((auVar101 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar101 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar101 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar101 >> 0x7f,0) == '\0') &&
                  (auVar101 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar101 >> 0xbf,0) == '\0') &&
                (auVar101 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar101[0x1f]) goto LAB_01153d57;
            auVar101 = vcmpps_avx(ZEXT1632(auVar138),ZEXT832(0) << 0x20,4);
            auVar12 = vpackssdw_avx(auVar101._0_16_,auVar101._16_16_);
            auVar10 = vpand_avx(auVar10,auVar12);
            auVar101 = vpmovsxwd_avx2(auVar10);
            auVar156._8_8_ = uStack_658;
            auVar156._0_8_ = local_660;
            auVar156._16_8_ = uStack_650;
            auVar156._24_8_ = uStack_648;
            if ((((((((auVar101 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar101 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar101 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar101 >> 0x7f,0) != '\0') ||
                  (auVar101 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar101 >> 0xbf,0) != '\0') ||
                (auVar101 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar101[0x1f] < '\0') {
              auVar100 = ZEXT1632(CONCAT412(fVar192 * auVar13._12_4_,
                                            CONCAT48(fVar191 * auVar13._8_4_,
                                                     CONCAT44(fVar188 * auVar13._4_4_,
                                                              fVar113 * auVar13._0_4_))));
              auVar63._28_4_ = SUB84(uStack_648,4);
              auVar63._0_28_ =
                   ZEXT1628(CONCAT412(fVar192 * auVar90._12_4_,
                                      CONCAT48(fVar191 * auVar90._8_4_,
                                               CONCAT44(fVar188 * auVar90._4_4_,
                                                        fVar113 * auVar90._0_4_))));
              auVar190._8_4_ = 0x3f800000;
              auVar190._0_8_ = 0x3f8000003f800000;
              auVar190._12_4_ = 0x3f800000;
              auVar190._16_4_ = 0x3f800000;
              auVar190._20_4_ = 0x3f800000;
              auVar190._24_4_ = 0x3f800000;
              auVar190._28_4_ = 0x3f800000;
              auVar117 = vsubps_avx(auVar190,auVar100);
              local_780 = vblendvps_avx(auVar117,auVar100,auVar14);
              auVar117 = vsubps_avx(auVar190,auVar63);
              local_500 = vblendvps_avx(auVar117,auVar63,auVar14);
              auVar156 = auVar101;
              local_600 = auVar171;
            }
          }
          auVar207 = ZEXT3264(local_640);
          if ((((((((auVar156 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar156 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar156 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar156 >> 0x7f,0) == '\0') &&
                (auVar156 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar156 >> 0xbf,0) == '\0') &&
              (auVar156 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar156[0x1f]) {
            auVar135 = ZEXT3264(local_780);
          }
          else {
            auVar101 = vsubps_avx(ZEXT1632(auVar11),auVar102);
            auVar10 = vfmadd213ps_fma(auVar101,local_780,auVar102);
            fVar113 = *(float *)((long)pre->ray_space + k * 4 + -0x20);
            auVar64._4_4_ = (auVar10._4_4_ + auVar10._4_4_) * fVar113;
            auVar64._0_4_ = (auVar10._0_4_ + auVar10._0_4_) * fVar113;
            auVar64._8_4_ = (auVar10._8_4_ + auVar10._8_4_) * fVar113;
            auVar64._12_4_ = (auVar10._12_4_ + auVar10._12_4_) * fVar113;
            auVar64._16_4_ = fVar113 * 0.0;
            auVar64._20_4_ = fVar113 * 0.0;
            auVar64._24_4_ = fVar113 * 0.0;
            auVar64._28_4_ = fVar113;
            auVar101 = vcmpps_avx(local_600,auVar64,6);
            auVar117 = auVar156 & auVar101;
            if ((((((((auVar117 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar117 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar117 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar117 >> 0x7f,0) == '\0') &&
                  (auVar117 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar117 >> 0xbf,0) == '\0') &&
                (auVar117 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar117[0x1f]) {
              auVar135 = ZEXT3264(local_780);
            }
            else {
              auVar129._8_4_ = 0xbf800000;
              auVar129._0_8_ = 0xbf800000bf800000;
              auVar129._12_4_ = 0xbf800000;
              auVar129._16_4_ = 0xbf800000;
              auVar129._20_4_ = 0xbf800000;
              auVar129._24_4_ = 0xbf800000;
              auVar129._28_4_ = 0xbf800000;
              auVar149._8_4_ = 0x40000000;
              auVar149._0_8_ = 0x4000000040000000;
              auVar149._12_4_ = 0x40000000;
              auVar149._16_4_ = 0x40000000;
              auVar149._20_4_ = 0x40000000;
              auVar149._24_4_ = 0x40000000;
              auVar149._28_4_ = 0x40000000;
              auVar10 = vfmadd213ps_fma(local_500,auVar149,auVar129);
              local_3e0 = local_780;
              local_3c0 = ZEXT1632(auVar10);
              local_3a0 = local_600;
              local_370 = local_840;
              uStack_368 = uStack_838;
              local_360 = local_8e0;
              uStack_358 = uStack_8d8;
              local_350 = local_8f0;
              uStack_348 = uStack_8e8;
              local_340 = local_850;
              uStack_338 = uStack_848;
              pGVar7 = (context->scene->geometries).items[local_7d0].ptr;
              auVar135 = ZEXT3264(local_780);
              auVar150 = ZEXT3264(CONCAT428(fStack_724,
                                            CONCAT424(fStack_728,
                                                      CONCAT420(fStack_72c,
                                                                CONCAT416(fStack_730,
                                                                          CONCAT412(fStack_734,
                                                                                    CONCAT48(
                                                  fStack_738,CONCAT44(fStack_73c,local_740))))))));
              local_500 = local_3c0;
              if ((pGVar7->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) goto LAB_01153d1c;
              local_6c0 = vandps_avx(auVar101,auVar156);
              fVar137 = (float)local_380;
              local_300[0] = (fVar137 + local_780._0_4_ + 0.0) * local_e0;
              local_300[1] = (fVar137 + local_780._4_4_ + 1.0) * fStack_dc;
              local_300[2] = (fVar137 + local_780._8_4_ + 2.0) * fStack_d8;
              local_300[3] = (fVar137 + local_780._12_4_ + 3.0) * fStack_d4;
              fStack_2f0 = (fVar137 + local_780._16_4_ + 4.0) * fStack_d0;
              fStack_2ec = (fVar137 + local_780._20_4_ + 5.0) * fStack_cc;
              fStack_2e8 = (fVar137 + local_780._24_4_ + 6.0) * fStack_c8;
              fStack_2e4 = fVar137 + local_780._28_4_ + 7.0;
              local_500._0_8_ = auVar10._0_8_;
              local_500._8_8_ = auVar10._8_8_;
              local_2e0 = local_500._0_8_;
              uStack_2d8 = local_500._8_8_;
              uStack_2d0 = 0;
              uStack_2c8 = 0;
              local_2c0 = local_600;
              auVar130._8_4_ = 0x7f800000;
              auVar130._0_8_ = 0x7f8000007f800000;
              auVar130._12_4_ = 0x7f800000;
              auVar130._16_4_ = 0x7f800000;
              auVar130._20_4_ = 0x7f800000;
              auVar130._24_4_ = 0x7f800000;
              auVar130._28_4_ = 0x7f800000;
              auVar101 = vblendvps_avx(auVar130,local_600,local_6c0);
              auVar117 = vshufps_avx(auVar101,auVar101,0xb1);
              auVar117 = vminps_avx(auVar101,auVar117);
              auVar171 = vshufpd_avx(auVar117,auVar117,5);
              auVar117 = vminps_avx(auVar117,auVar171);
              auVar171 = vpermpd_avx2(auVar117,0x4e);
              auVar117 = vminps_avx(auVar117,auVar171);
              auVar117 = vcmpps_avx(auVar101,auVar117,0);
              auVar171 = local_6c0 & auVar117;
              auVar101 = local_6c0;
              if ((((((((auVar171 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar171 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar171 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar171 >> 0x7f,0) != '\0') ||
                    (auVar171 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar171 >> 0xbf,0) != '\0') ||
                  (auVar171 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar171[0x1f] < '\0') {
                auVar101 = vandps_avx(auVar117,local_6c0);
              }
              uVar78 = vmovmskps_avx(auVar101);
              uVar81 = 0;
              for (; (uVar78 & 1) == 0; uVar78 = uVar78 >> 1 | 0x80000000) {
                uVar81 = uVar81 + 1;
              }
              uVar82 = (ulong)uVar81;
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar7->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                fVar137 = local_300[uVar82];
                uVar208 = *(undefined4 *)((long)&local_2e0 + uVar82 * 4);
                fVar106 = 1.0 - fVar137;
                fVar136 = fVar106 * fVar106 * -3.0;
                auVar10 = vfmadd231ss_fma(ZEXT416((uint)(fVar106 * fVar106)),
                                          ZEXT416((uint)(fVar137 * fVar106)),ZEXT416(0xc0000000));
                auVar11 = vfmsub132ss_fma(ZEXT416((uint)(fVar137 * fVar106)),
                                          ZEXT416((uint)(fVar137 * fVar137)),ZEXT416(0x40000000));
                fVar106 = auVar10._0_4_ * 3.0;
                fVar108 = auVar11._0_4_ * 3.0;
                fVar110 = fVar137 * fVar137 * 3.0;
                auVar168._0_4_ = fVar110 * fVar105;
                auVar168._4_4_ = fVar110 * fVar107;
                auVar168._8_4_ = fVar110 * fVar109;
                auVar168._12_4_ = fVar110 * fVar66;
                auVar141._4_4_ = fVar108;
                auVar141._0_4_ = fVar108;
                auVar141._8_4_ = fVar108;
                auVar141._12_4_ = fVar108;
                auVar10 = vfmadd132ps_fma(auVar141,auVar168,auVar89);
                auVar154._4_4_ = fVar106;
                auVar154._0_4_ = fVar106;
                auVar154._8_4_ = fVar106;
                auVar154._12_4_ = fVar106;
                auVar10 = vfmadd132ps_fma(auVar154,auVar10,auVar151);
                auVar142._4_4_ = fVar136;
                auVar142._0_4_ = fVar136;
                auVar142._8_4_ = fVar136;
                auVar142._12_4_ = fVar136;
                auVar10 = vfmadd132ps_fma(auVar142,auVar10,auVar9);
                *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_2c0 + uVar82 * 4);
                *(int *)(ray + k * 4 + 0x180) = auVar10._0_4_;
                uVar6 = vextractps_avx(auVar10,1);
                *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar6;
                uVar6 = vextractps_avx(auVar10,2);
                *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar6;
                *(float *)(ray + k * 4 + 0x1e0) = fVar137;
                *(undefined4 *)(ray + k * 4 + 0x200) = uVar208;
                *(int *)(ray + k * 4 + 0x220) = (int)local_7a8;
                *(int *)(ray + k * 4 + 0x240) = (int)local_7d0;
                *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
              }
              else {
                uVar208 = *(undefined4 *)(ray + k * 4 + 0x100);
                auVar135 = ZEXT864(0) << 0x20;
                auVar101 = vpcmpeqd_avx2(auVar190,auVar190);
                auVar150 = ZEXT3264(auVar101);
                local_7b8 = ray;
                _local_440 = *pauVar1;
                local_37c = iVar77;
                while( true ) {
                  local_1a0 = local_300[uVar82];
                  local_180 = *(undefined4 *)((long)&local_2e0 + uVar82 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_2c0 + uVar82 * 4);
                  fVar106 = 1.0 - local_1a0;
                  auVar11 = vfmadd231ss_fma(ZEXT416((uint)(fVar106 * fVar106)),
                                            ZEXT416((uint)(local_1a0 * fVar106)),ZEXT416(0xc0000000)
                                           );
                  auVar10 = vfmsub132ss_fma(ZEXT416((uint)(local_1a0 * fVar106)),
                                            ZEXT416((uint)(local_1a0 * local_1a0)),
                                            ZEXT416(0x40000000));
                  fVar137 = auVar10._0_4_ * 3.0;
                  fVar136 = local_1a0 * local_1a0 * 3.0;
                  auVar169._0_4_ = fVar136 * fVar105;
                  auVar169._4_4_ = fVar136 * fVar107;
                  auVar169._8_4_ = fVar136 * fVar109;
                  auVar169._12_4_ = fVar136 * fVar66;
                  auVar143._4_4_ = fVar137;
                  auVar143._0_4_ = fVar137;
                  auVar143._8_4_ = fVar137;
                  auVar143._12_4_ = fVar137;
                  auVar10 = vfmadd132ps_fma(auVar143,auVar169,auVar89);
                  fVar137 = auVar11._0_4_ * 3.0;
                  auVar159._4_4_ = fVar137;
                  auVar159._0_4_ = fVar137;
                  auVar159._8_4_ = fVar137;
                  auVar159._12_4_ = fVar137;
                  auVar10 = vfmadd132ps_fma(auVar159,auVar10,auVar151);
                  fVar137 = fVar106 * fVar106 * -3.0;
                  local_830.context = context->user;
                  auVar144._4_4_ = fVar137;
                  auVar144._0_4_ = fVar137;
                  auVar144._8_4_ = fVar137;
                  auVar144._12_4_ = fVar137;
                  auVar11 = vfmadd132ps_fma(auVar144,auVar10,auVar9);
                  local_200 = auVar11._0_4_;
                  uStack_1fc = local_200;
                  uStack_1f8 = local_200;
                  uStack_1f4 = local_200;
                  uStack_1f0 = local_200;
                  uStack_1ec = local_200;
                  uStack_1e8 = local_200;
                  uStack_1e4 = local_200;
                  auVar10 = vmovshdup_avx(auVar11);
                  local_1e0 = auVar10._0_8_;
                  uStack_1d8 = local_1e0;
                  uStack_1d0 = local_1e0;
                  uStack_1c8 = local_1e0;
                  auVar10 = vshufps_avx(auVar11,auVar11,0xaa);
                  local_1c0 = auVar10._0_8_;
                  uStack_1b8 = local_1c0;
                  uStack_1b0 = local_1c0;
                  uStack_1a8 = local_1c0;
                  fStack_19c = local_1a0;
                  fStack_198 = local_1a0;
                  fStack_194 = local_1a0;
                  fStack_190 = local_1a0;
                  fStack_18c = local_1a0;
                  fStack_188 = local_1a0;
                  fStack_184 = local_1a0;
                  uStack_17c = local_180;
                  uStack_178 = local_180;
                  uStack_174 = local_180;
                  uStack_170 = local_180;
                  uStack_16c = local_180;
                  uStack_168 = local_180;
                  uStack_164 = local_180;
                  local_160 = local_560._0_8_;
                  uStack_158 = local_560._8_8_;
                  uStack_150 = CONCAT44(uStack_54c,uStack_550);
                  uStack_148 = CONCAT44(uStack_544,uStack_548);
                  local_140 = CONCAT44(fStack_53c,local_540);
                  uStack_138 = CONCAT44(fStack_534,fStack_538);
                  uStack_130 = CONCAT44(uStack_52c,uStack_530);
                  uStack_128 = CONCAT44(uStack_524,uStack_528);
                  local_7b0[1] = auVar150._0_32_;
                  *local_7b0 = auVar150._0_32_;
                  local_120 = (local_830.context)->instID[0];
                  uStack_11c = local_120;
                  uStack_118 = local_120;
                  uStack_114 = local_120;
                  uStack_110 = local_120;
                  uStack_10c = local_120;
                  uStack_108 = local_120;
                  uStack_104 = local_120;
                  local_100 = (local_830.context)->instPrimID[0];
                  uStack_fc = local_100;
                  uStack_f8 = local_100;
                  uStack_f4 = local_100;
                  uStack_f0 = local_100;
                  uStack_ec = local_100;
                  uStack_e8 = local_100;
                  uStack_e4 = local_100;
                  local_6a0 = local_2a0;
                  local_830.valid = (int *)local_6a0;
                  local_830.geometryUserPtr = pGVar7->userPtr;
                  local_830.hit = (RTCHitN *)&local_200;
                  local_830.N = 8;
                  local_830.ray = (RTCRayN *)ray;
                  if (pGVar7->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    auVar101 = ZEXT1632(auVar150._0_16_);
                    auVar215 = ZEXT1664(auVar215._0_16_);
                    (*pGVar7->intersectionFilterN)(&local_830);
                    auVar101 = vpcmpeqd_avx2(auVar101,auVar101);
                    auVar150 = ZEXT3264(auVar101);
                    auVar135 = ZEXT1664(ZEXT816(0) << 0x40);
                    ray = local_7b8;
                  }
                  auVar117 = vpcmpeqd_avx2(local_6a0,auVar135._0_32_);
                  auVar101 = auVar150._0_32_ & ~auVar117;
                  if ((((((((auVar101 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (auVar101 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar101 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar101 >> 0x7f,0) == '\0') &&
                        (auVar101 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(auVar101 >> 0xbf,0) == '\0') &&
                      (auVar101 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < auVar101[0x1f]) {
                    auVar117 = auVar150._0_32_ ^ auVar117;
                  }
                  else {
                    p_Var8 = context->args->filter;
                    if ((p_Var8 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar7->field_8).field_0x2 & 0x40) != 0)))) {
                      auVar101 = ZEXT1632(auVar150._0_16_);
                      auVar215 = ZEXT1664(auVar215._0_16_);
                      (*p_Var8)(&local_830);
                      auVar101 = vpcmpeqd_avx2(auVar101,auVar101);
                      auVar150 = ZEXT3264(auVar101);
                      auVar135 = ZEXT1664(ZEXT816(0) << 0x40);
                      ray = local_7b8;
                    }
                    auVar171 = vpcmpeqd_avx2(local_6a0,auVar135._0_32_);
                    auVar117 = auVar150._0_32_ ^ auVar171;
                    auVar101 = auVar150._0_32_ & ~auVar171;
                    if ((((((((auVar101 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar101 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar101 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar101 >> 0x7f,0) != '\0') ||
                          (auVar101 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar101 >> 0xbf,0) != '\0') ||
                        (auVar101 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar101[0x1f] < '\0') {
                      auVar131._0_4_ = auVar150._0_4_ ^ auVar171._0_4_;
                      auVar131._4_4_ = auVar150._4_4_ ^ auVar171._4_4_;
                      auVar131._8_4_ = auVar150._8_4_ ^ auVar171._8_4_;
                      auVar131._12_4_ = auVar150._12_4_ ^ auVar171._12_4_;
                      auVar131._16_4_ = auVar150._16_4_ ^ auVar171._16_4_;
                      auVar131._20_4_ = auVar150._20_4_ ^ auVar171._20_4_;
                      auVar131._24_4_ = auVar150._24_4_ ^ auVar171._24_4_;
                      auVar131._28_4_ = auVar150._28_4_ ^ auVar171._28_4_;
                      auVar101 = vmaskmovps_avx(auVar131,*(undefined1 (*) [32])local_830.hit);
                      *(undefined1 (*) [32])(local_830.ray + 0x180) = auVar101;
                      auVar101 = vmaskmovps_avx(auVar131,*(undefined1 (*) [32])
                                                          (local_830.hit + 0x20));
                      *(undefined1 (*) [32])(local_830.ray + 0x1a0) = auVar101;
                      auVar101 = vmaskmovps_avx(auVar131,*(undefined1 (*) [32])
                                                          (local_830.hit + 0x40));
                      *(undefined1 (*) [32])(local_830.ray + 0x1c0) = auVar101;
                      auVar101 = vmaskmovps_avx(auVar131,*(undefined1 (*) [32])
                                                          (local_830.hit + 0x60));
                      *(undefined1 (*) [32])(local_830.ray + 0x1e0) = auVar101;
                      auVar101 = vmaskmovps_avx(auVar131,*(undefined1 (*) [32])
                                                          (local_830.hit + 0x80));
                      *(undefined1 (*) [32])(local_830.ray + 0x200) = auVar101;
                      auVar101 = vpmaskmovd_avx2(auVar131,*(undefined1 (*) [32])
                                                           (local_830.hit + 0xa0));
                      *(undefined1 (*) [32])(local_830.ray + 0x220) = auVar101;
                      auVar101 = vpmaskmovd_avx2(auVar131,*(undefined1 (*) [32])
                                                           (local_830.hit + 0xc0));
                      *(undefined1 (*) [32])(local_830.ray + 0x240) = auVar101;
                      auVar101 = vpmaskmovd_avx2(auVar131,*(undefined1 (*) [32])
                                                           (local_830.hit + 0xe0));
                      *(undefined1 (*) [32])(local_830.ray + 0x260) = auVar101;
                      auVar101 = vpmaskmovd_avx2(auVar131,*(undefined1 (*) [32])
                                                           (local_830.hit + 0x100));
                      *(undefined1 (*) [32])(local_830.ray + 0x280) = auVar101;
                    }
                  }
                  auVar101 = local_600;
                  if ((((((((auVar117 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (auVar117 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar117 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar117 >> 0x7f,0) == '\0') &&
                        (auVar117 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(auVar117 >> 0xbf,0) == '\0') &&
                      (auVar117 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < auVar117[0x1f]) {
                    *(undefined4 *)(ray + k * 4 + 0x100) = uVar208;
                  }
                  else {
                    uVar208 = *(undefined4 *)(ray + k * 4 + 0x100);
                  }
                  *(undefined4 *)(local_6c0 + uVar82 * 4) = 0;
                  auVar103._4_4_ = uVar208;
                  auVar103._0_4_ = uVar208;
                  auVar103._8_4_ = uVar208;
                  auVar103._12_4_ = uVar208;
                  auVar103._16_4_ = uVar208;
                  auVar103._20_4_ = uVar208;
                  auVar103._24_4_ = uVar208;
                  auVar103._28_4_ = uVar208;
                  auVar171 = vcmpps_avx(auVar101,auVar103,2);
                  auVar117 = vandps_avx(auVar171,local_6c0);
                  local_6c0 = local_6c0 & auVar171;
                  if ((((((((local_6c0 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (local_6c0 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (local_6c0 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(local_6c0 >> 0x7f,0) == '\0') &&
                        (local_6c0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(local_6c0 >> 0xbf,0) == '\0') &&
                      (local_6c0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < local_6c0[0x1f]) break;
                  auVar132._8_4_ = 0x7f800000;
                  auVar132._0_8_ = 0x7f8000007f800000;
                  auVar132._12_4_ = 0x7f800000;
                  auVar132._16_4_ = 0x7f800000;
                  auVar132._20_4_ = 0x7f800000;
                  auVar132._24_4_ = 0x7f800000;
                  auVar132._28_4_ = 0x7f800000;
                  auVar101 = vblendvps_avx(auVar132,auVar101,auVar117);
                  auVar171 = vshufps_avx(auVar101,auVar101,0xb1);
                  auVar171 = vminps_avx(auVar101,auVar171);
                  auVar100 = vshufpd_avx(auVar171,auVar171,5);
                  auVar171 = vminps_avx(auVar171,auVar100);
                  auVar100 = vpermpd_avx2(auVar171,0x4e);
                  auVar171 = vminps_avx(auVar171,auVar100);
                  auVar171 = vcmpps_avx(auVar101,auVar171,0);
                  auVar100 = auVar117 & auVar171;
                  auVar101 = auVar117;
                  if ((((((((auVar100 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar100 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar100 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar100 >> 0x7f,0) != '\0') ||
                        (auVar100 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar100 >> 0xbf,0) != '\0') ||
                      (auVar100 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar100[0x1f] < '\0') {
                    auVar101 = vandps_avx(auVar171,auVar117);
                  }
                  uVar78 = vmovmskps_avx(auVar101);
                  uVar81 = 0;
                  for (; (uVar78 & 1) == 0; uVar78 = uVar78 >> 1 | 0x80000000) {
                    uVar81 = uVar81 + 1;
                  }
                  uVar82 = (ulong)uVar81;
                  local_6c0 = auVar117;
                }
                auVar207 = ZEXT3264(local_640);
              }
              auVar135 = ZEXT3264(local_780);
              fVar137 = (float)local_620;
              fVar136 = local_620._4_4_;
              fVar106 = (float)uStack_618;
              fVar108 = uStack_618._4_4_;
              fVar110 = (float)uStack_610;
              fVar111 = uStack_610._4_4_;
              fVar112 = (float)uStack_608;
            }
          }
          auVar150 = ZEXT3264(CONCAT428(fStack_724,
                                        CONCAT424(fStack_728,
                                                  CONCAT420(fStack_72c,
                                                            CONCAT416(fStack_730,
                                                                      CONCAT412(fStack_734,
                                                                                CONCAT48(fStack_738,
                                                                                         CONCAT44(
                                                  fStack_73c,local_740))))))));
        }
LAB_01153d1c:
      }
    }
    uVar84 = *(undefined4 *)(ray + k * 4 + 0x100);
    auVar93._4_4_ = uVar84;
    auVar93._0_4_ = uVar84;
    auVar93._8_4_ = uVar84;
    auVar93._12_4_ = uVar84;
    auVar9 = vcmpps_avx(local_400,auVar93,2);
    uVar81 = vmovmskps_avx(auVar9);
    uVar79 = (ulong)((uint)uVar79 & (uint)uVar79 + 0xf & uVar81);
  } while( true );
}

Assistant:

static __forceinline void intersect_h(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; geom->gather_hermite(p0,t0,p1,t1,geom->curve(primID));
          Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }